

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::sse2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Primitive PVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Geometry *pGVar22;
  __int_type_conflict _Var23;
  long lVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined3 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  uint uVar73;
  unkbyte9 Var74;
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [13];
  undefined1 auVar78 [12];
  undefined1 auVar79 [13];
  undefined1 auVar80 [12];
  undefined1 auVar81 [13];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined6 uVar84;
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [15];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  bool bVar101;
  bool bVar102;
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [13];
  undefined1 auVar108 [15];
  byte bVar109;
  ulong uVar110;
  ulong uVar111;
  RTCFilterFunctionN p_Var112;
  RTCRayN *pRVar113;
  long lVar114;
  long lVar115;
  ulong uVar116;
  ulong uVar117;
  bool bVar118;
  uint uVar119;
  uint uVar120;
  uint uVar121;
  uint uVar122;
  short sVar123;
  int iVar124;
  undefined1 auVar125 [12];
  int iVar183;
  vfloat_impl<4> p00;
  char cVar186;
  undefined1 auVar131 [16];
  undefined1 auVar127 [12];
  undefined1 auVar135 [16];
  undefined1 auVar128 [12];
  undefined1 auVar139 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar129 [12];
  undefined1 auVar149 [16];
  undefined1 auVar130 [12];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar169 [16];
  float fVar187;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar188;
  float fVar189;
  undefined2 uVar222;
  float fVar223;
  undefined2 uVar225;
  float fVar226;
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar190;
  float fVar224;
  float fVar227;
  float fVar228;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  char cVar229;
  float fVar230;
  char cVar246;
  float fVar247;
  float fVar249;
  vfloat4 a_1;
  float fVar231;
  undefined1 auVar234 [16];
  float fVar248;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar250;
  char cVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar257 [16];
  float fVar263;
  float fVar264;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar300;
  undefined1 auVar285 [16];
  undefined1 auVar289 [16];
  float fVar301;
  float fVar302;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar309;
  float fVar312;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar310;
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar308 [16];
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar340;
  float fVar341;
  undefined1 uVar354;
  float fVar355;
  float fVar357;
  undefined1 auVar342 [16];
  undefined1 auVar345 [16];
  float fVar356;
  float fVar358;
  float fVar359;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float fVar360;
  float fVar373;
  float fVar374;
  undefined1 auVar362 [16];
  float fVar377;
  undefined1 auVar365 [16];
  float fVar361;
  float fVar375;
  float fVar376;
  float fVar378;
  float fVar379;
  float fVar380;
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  float fVar381;
  float fVar382;
  float fVar389;
  float fVar392;
  vfloat4 a;
  undefined1 auVar383 [16];
  float fVar390;
  float fVar391;
  float fVar393;
  float fVar394;
  float fVar395;
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar406;
  float fVar410;
  vfloat4 a_2;
  float fVar407;
  float fVar411;
  float fVar414;
  undefined1 auVar400 [16];
  float fVar408;
  float fVar412;
  float fVar415;
  float fVar416;
  undefined1 auVar401 [16];
  float fVar409;
  float fVar413;
  float fVar417;
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar425;
  float fVar428;
  undefined1 auVar421 [16];
  float fVar426;
  float fVar427;
  float fVar429;
  float fVar430;
  float fVar431;
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  float fVar432;
  float fVar433;
  float fVar436;
  float fVar437;
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar450;
  float fVar452;
  undefined1 auVar442 [16];
  float fVar454;
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  float fVar451;
  float fVar453;
  float fVar455;
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  float fVar456;
  float fVar457;
  float fVar462;
  float fVar464;
  undefined1 auVar458 [16];
  float fVar463;
  float fVar465;
  float fVar466;
  undefined1 auVar461 [16];
  BBox1f local_548;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined8 local_508;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_3b8 [16];
  undefined1 (*local_3a0) [16];
  Primitive *local_398;
  ulong local_390;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar126 [12];
  undefined1 auVar146 [16];
  undefined1 auVar150 [16];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar147 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar141 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined2 uVar182;
  int iVar184;
  int iVar185;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar232 [12];
  undefined1 auVar235 [16];
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  
  PVar14 = prim[1];
  uVar110 = (ulong)(byte)PVar14;
  lVar114 = uVar110 * 0x25;
  uVar4 = *(undefined4 *)(prim + uVar110 * 4 + 6);
  uVar15 = *(undefined4 *)(prim + uVar110 * 5 + 6);
  uVar16 = *(undefined4 *)(prim + uVar110 * 6 + 6);
  uVar17 = *(undefined4 *)(prim + uVar110 * 0xf + 6);
  uVar18 = *(undefined4 *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  uVar19 = *(undefined4 *)(prim + uVar110 * 0x11 + 6);
  uVar20 = *(undefined4 *)(prim + uVar110 * 0x1a + 6);
  uVar21 = *(undefined4 *)(prim + uVar110 * 0x1b + 6);
  auVar144 = *(undefined1 (*) [16])(prim + lVar114 + 6);
  auVar252._12_4_ = auVar144._12_4_;
  fVar188 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar114 + 0x16)) *
            *(float *)(prim + lVar114 + 0x1a);
  auVar125._0_8_ = CONCAT44(auVar252._12_4_,auVar252._12_4_);
  auVar125._8_4_ = auVar252._12_4_;
  auVar252._0_12_ = auVar125;
  fVar189 = (*(float *)(ray + k * 4) - auVar144._0_4_) * auVar252._12_4_;
  fVar223 = (*(float *)(ray + k * 4 + 0x10) - auVar144._4_4_) * auVar252._12_4_;
  fVar226 = (*(float *)(ray + k * 4 + 0x20) - auVar144._8_4_) * auVar252._12_4_;
  fVar396 = *(float *)(ray + k * 4 + 0x40) * auVar252._12_4_;
  fVar406 = *(float *)(ray + k * 4 + 0x50) * auVar252._12_4_;
  fVar410 = *(float *)(ray + k * 4 + 0x60) * auVar252._12_4_;
  auVar41[0xd] = 0;
  auVar41._0_13_ = auVar252._0_13_;
  auVar41[0xe] = auVar144[0xf];
  auVar45[0xc] = auVar144[0xe];
  auVar45._0_12_ = auVar125;
  auVar45._13_2_ = auVar41._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar125._0_11_;
  auVar49._12_3_ = auVar45._12_3_;
  auVar53[10] = auVar144[0xd];
  auVar53._0_10_ = auVar125._0_10_;
  auVar53._11_4_ = auVar49._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar125._0_9_;
  auVar57._10_5_ = auVar53._10_5_;
  auVar61[8] = auVar144[0xc];
  auVar61._0_8_ = auVar125._0_8_;
  auVar61._9_6_ = auVar57._9_6_;
  Var74 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar15 >> 0x18)),auVar144[0xf]);
  auVar65._6_9_ = Var74;
  auVar65[5] = (char)((uint)uVar15 >> 0x10);
  auVar65[4] = auVar144[0xe];
  auVar65._0_4_ = auVar252._12_4_;
  cVar246 = (char)((uint)uVar15 >> 8);
  auVar75._2_11_ = auVar65._4_11_;
  auVar75[1] = cVar246;
  auVar75[0] = auVar144[0xd];
  cVar229 = (char)uVar15;
  sVar123 = CONCAT11(cVar229,auVar144[0xc]);
  auVar69._2_13_ = auVar75;
  auVar69._0_2_ = sVar123;
  uVar182 = (undefined2)Var74;
  auVar144._0_12_ = auVar69._0_12_;
  auVar144._12_2_ = uVar182;
  auVar144._14_2_ = uVar182;
  auVar206._12_4_ = auVar144._12_4_;
  auVar206._0_10_ = auVar69._0_10_;
  auVar206._10_2_ = auVar65._4_2_;
  auVar239._10_6_ = auVar206._10_6_;
  auVar239._0_8_ = auVar69._0_8_;
  auVar239._8_2_ = auVar65._4_2_;
  auVar76._4_8_ = auVar239._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  iVar124 = (int)sVar123 >> 8;
  iVar183 = auVar76._0_4_ >> 0x18;
  auVar126._0_8_ = CONCAT44(iVar183,iVar124);
  auVar126._8_4_ = auVar239._8_4_ >> 0x18;
  auVar367._12_4_ = auVar206._12_4_ >> 0x18;
  auVar367._0_12_ = auVar126;
  fVar389 = (float)iVar183;
  cVar186 = cVar246 >> 7;
  auVar42[0xd] = 0;
  auVar42._0_13_ = auVar367._0_13_;
  auVar42[0xe] = cVar186;
  auVar46[0xc] = cVar186;
  auVar46._0_12_ = auVar126;
  auVar46._13_2_ = auVar42._13_2_;
  auVar50[0xb] = 0;
  auVar50._0_11_ = auVar126._0_11_;
  auVar50._12_3_ = auVar46._12_3_;
  auVar54[10] = cVar186;
  auVar54._0_10_ = auVar126._0_10_;
  auVar54._11_4_ = auVar50._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar126._0_9_;
  auVar58._10_5_ = auVar54._10_5_;
  auVar62[8] = cVar246;
  auVar62._0_8_ = auVar126._0_8_;
  auVar62._9_6_ = auVar58._9_6_;
  Var74 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar16 >> 0x18)),(short)cVar229 >> 7);
  auVar66._6_9_ = Var74;
  auVar66[5] = (char)((uint)uVar16 >> 0x10);
  auVar66[4] = (undefined1)((short)cVar229 >> 7);
  auVar66._0_4_ = iVar124;
  cVar260 = (char)((uint)uVar16 >> 8);
  auVar77._2_11_ = auVar66._4_11_;
  auVar77[1] = cVar260;
  auVar77[0] = (undefined1)((short)cVar229 >> 7);
  cVar246 = (char)uVar16;
  auVar70._2_13_ = auVar77;
  auVar70._0_2_ = CONCAT11(cVar246,cVar229);
  uVar182 = (undefined2)Var74;
  auVar133._0_12_ = auVar70._0_12_;
  auVar133._12_2_ = uVar182;
  auVar133._14_2_ = uVar182;
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._0_10_ = auVar70._0_10_;
  auVar132._10_2_ = auVar66._4_2_;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._0_8_ = auVar70._0_8_;
  auVar131._8_2_ = auVar66._4_2_;
  auVar78._4_8_ = auVar131._8_8_;
  auVar78._2_2_ = auVar77._0_2_;
  auVar78._0_2_ = auVar77._0_2_;
  iVar183 = (int)CONCAT11(cVar246,cVar229) >> 8;
  iVar184 = auVar78._0_4_ >> 0x18;
  auVar127._0_8_ = CONCAT44(iVar184,iVar183);
  auVar127._8_4_ = auVar131._8_4_ >> 0x18;
  auVar134._12_4_ = auVar132._12_4_ >> 0x18;
  auVar134._0_12_ = auVar127;
  fVar425 = (float)iVar184;
  cVar186 = cVar260 >> 7;
  auVar43[0xd] = 0;
  auVar43._0_13_ = auVar134._0_13_;
  auVar43[0xe] = cVar186;
  auVar47[0xc] = cVar186;
  auVar47._0_12_ = auVar127;
  auVar47._13_2_ = auVar43._13_2_;
  auVar51[0xb] = 0;
  auVar51._0_11_ = auVar127._0_11_;
  auVar51._12_3_ = auVar47._12_3_;
  auVar55[10] = cVar186;
  auVar55._0_10_ = auVar127._0_10_;
  auVar55._11_4_ = auVar51._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar127._0_9_;
  auVar59._10_5_ = auVar55._10_5_;
  auVar63[8] = cVar260;
  auVar63._0_8_ = auVar127._0_8_;
  auVar63._9_6_ = auVar59._9_6_;
  Var74 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar18 >> 0x18)),(short)cVar246 >> 7);
  auVar67._6_9_ = Var74;
  auVar67[5] = (char)((uint)uVar18 >> 0x10);
  auVar67[4] = (undefined1)((short)cVar246 >> 7);
  auVar67._0_4_ = iVar183;
  cVar260 = (char)((uint)uVar18 >> 8);
  auVar79._2_11_ = auVar67._4_11_;
  auVar79[1] = cVar260;
  auVar79[0] = (undefined1)((short)cVar246 >> 7);
  cVar229 = (char)uVar18;
  auVar71._2_13_ = auVar79;
  auVar71._0_2_ = CONCAT11(cVar229,cVar246);
  uVar182 = (undefined2)Var74;
  auVar137._0_12_ = auVar71._0_12_;
  auVar137._12_2_ = uVar182;
  auVar137._14_2_ = uVar182;
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_10_ = auVar71._0_10_;
  auVar136._10_2_ = auVar67._4_2_;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._0_8_ = auVar71._0_8_;
  auVar135._8_2_ = auVar67._4_2_;
  auVar80._4_8_ = auVar135._8_8_;
  auVar80._2_2_ = auVar79._0_2_;
  auVar80._0_2_ = auVar79._0_2_;
  iVar184 = (int)CONCAT11(cVar229,cVar246) >> 8;
  iVar185 = auVar80._0_4_ >> 0x18;
  auVar128._0_8_ = CONCAT44(iVar185,iVar184);
  auVar128._8_4_ = auVar135._8_4_ >> 0x18;
  auVar138._12_4_ = auVar136._12_4_ >> 0x18;
  auVar138._0_12_ = auVar128;
  fVar327 = (float)iVar185;
  cVar186 = cVar260 >> 7;
  auVar44[0xd] = 0;
  auVar44._0_13_ = auVar138._0_13_;
  auVar44[0xe] = cVar186;
  auVar48[0xc] = cVar186;
  auVar48._0_12_ = auVar128;
  auVar48._13_2_ = auVar44._13_2_;
  auVar52[0xb] = 0;
  auVar52._0_11_ = auVar128._0_11_;
  auVar52._12_3_ = auVar48._12_3_;
  auVar56[10] = cVar186;
  auVar56._0_10_ = auVar128._0_10_;
  auVar56._11_4_ = auVar52._11_4_;
  auVar60[9] = 0;
  auVar60._0_9_ = auVar128._0_9_;
  auVar60._10_5_ = auVar56._10_5_;
  auVar64[8] = cVar260;
  auVar64._0_8_ = auVar128._0_8_;
  auVar64._9_6_ = auVar60._9_6_;
  Var74 = CONCAT81(CONCAT71(auVar64._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar229 >> 7);
  auVar68._6_9_ = Var74;
  auVar68[5] = (char)((uint)uVar19 >> 0x10);
  auVar68[4] = (undefined1)((short)cVar229 >> 7);
  auVar68._0_4_ = iVar184;
  auVar81._2_11_ = auVar68._4_11_;
  auVar81[1] = (char)((uint)uVar19 >> 8);
  auVar81[0] = (undefined1)((short)cVar229 >> 7);
  sVar123 = CONCAT11((char)uVar19,cVar229);
  auVar72._2_13_ = auVar81;
  auVar72._0_2_ = sVar123;
  uVar182 = (undefined2)Var74;
  auVar141._0_12_ = auVar72._0_12_;
  auVar141._12_2_ = uVar182;
  auVar141._14_2_ = uVar182;
  auVar140._12_4_ = auVar141._12_4_;
  auVar140._0_10_ = auVar72._0_10_;
  auVar140._10_2_ = auVar68._4_2_;
  auVar139._10_6_ = auVar140._10_6_;
  auVar139._0_8_ = auVar72._0_8_;
  auVar139._8_2_ = auVar68._4_2_;
  auVar82._4_8_ = auVar139._8_8_;
  auVar82._2_2_ = auVar81._0_2_;
  auVar82._0_2_ = auVar81._0_2_;
  fVar265 = (float)((int)sVar123 >> 8);
  fVar278 = (float)(auVar82._0_4_ >> 0x18);
  fVar281 = (float)(auVar139._8_4_ >> 0x18);
  fVar230 = fVar410 * fVar265;
  fVar247 = fVar410 * fVar278;
  auVar232._0_8_ = CONCAT44(fVar247,fVar230);
  auVar232._8_4_ = fVar410 * fVar281;
  auVar233._12_4_ = fVar410 * (float)(auVar140._12_4_ >> 0x18);
  auVar233._0_12_ = auVar232;
  uVar15 = *(undefined4 *)(prim + uVar110 * 0x1c + 6);
  local_538[0] = (undefined1)uVar4;
  local_538[1] = (undefined1)((uint)uVar4 >> 8);
  local_538[2] = (undefined1)((uint)uVar4 >> 0x10);
  local_538[3] = (undefined1)((uint)uVar4 >> 0x18);
  auVar96[0xd] = 0;
  auVar96._0_13_ = auVar233._0_13_;
  auVar96[0xe] = (char)((uint)fVar247 >> 0x18);
  auVar99[0xc] = (char)((uint)fVar247 >> 0x10);
  auVar99._0_12_ = auVar232;
  auVar99._13_2_ = auVar96._13_2_;
  auVar100[0xb] = 0;
  auVar100._0_11_ = auVar232._0_11_;
  auVar100._12_3_ = auVar99._12_3_;
  auVar103[10] = (char)((uint)fVar247 >> 8);
  auVar103._0_10_ = auVar232._0_10_;
  auVar103._11_4_ = auVar100._11_4_;
  auVar104[9] = 0;
  auVar104._0_9_ = auVar232._0_9_;
  auVar104._10_5_ = auVar103._10_5_;
  auVar105[8] = SUB41(fVar247,0);
  auVar105._0_8_ = auVar232._0_8_;
  auVar105._9_6_ = auVar104._9_6_;
  Var74 = CONCAT81(CONCAT71(auVar105._8_7_,local_538[3]),(char)((uint)fVar230 >> 0x18));
  auVar106._6_9_ = Var74;
  auVar106[5] = local_538[2];
  auVar106[4] = (char)((uint)fVar230 >> 0x10);
  auVar106._0_4_ = fVar230;
  auVar107._2_11_ = auVar106._4_11_;
  auVar107[1] = local_538[1];
  auVar107[0] = (char)((uint)fVar230 >> 8);
  sVar123 = CONCAT11(local_538[0],SUB41(fVar230,0));
  auVar108._2_13_ = auVar107;
  auVar108._0_2_ = sVar123;
  uVar182 = (undefined2)Var74;
  auVar236._0_12_ = auVar108._0_12_;
  auVar236._12_2_ = uVar182;
  auVar236._14_2_ = uVar182;
  auVar235._12_4_ = auVar236._12_4_;
  auVar235._0_10_ = auVar108._0_10_;
  auVar235._10_2_ = auVar106._4_2_;
  auVar234._10_6_ = auVar235._10_6_;
  auVar234._0_8_ = auVar108._0_8_;
  auVar234._8_2_ = auVar106._4_2_;
  auVar83._4_8_ = auVar234._8_8_;
  auVar83._2_2_ = auVar107._0_2_;
  auVar83._0_2_ = auVar107._0_2_;
  fVar303 = (float)((int)sVar123 >> 8);
  fVar309 = (float)(auVar83._0_4_ >> 0x18);
  fVar312 = (float)(auVar234._8_4_ >> 0x18);
  uVar354 = (undefined1)((uint)uVar17 >> 0x18);
  uVar182 = CONCAT11(uVar354,uVar354);
  uVar354 = (undefined1)((uint)uVar17 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar182,uVar354),CONCAT14(uVar354,uVar17));
  uVar354 = (undefined1)((uint)uVar17 >> 8);
  uVar84 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar354),uVar354);
  sVar123 = CONCAT11((char)uVar17,(char)uVar17);
  uVar116 = CONCAT62(uVar84,sVar123);
  auVar460._8_4_ = 0;
  auVar460._0_8_ = uVar116;
  auVar460._12_2_ = uVar182;
  auVar460._14_2_ = uVar182;
  uVar182 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar459._12_4_ = auVar460._12_4_;
  auVar459._8_2_ = 0;
  auVar459._0_8_ = uVar116;
  auVar459._10_2_ = uVar182;
  auVar458._10_6_ = auVar459._10_6_;
  auVar458._8_2_ = uVar182;
  auVar458._0_8_ = uVar116;
  uVar182 = (undefined2)uVar84;
  auVar85._4_8_ = auVar458._8_8_;
  auVar85._2_2_ = uVar182;
  auVar85._0_2_ = uVar182;
  fVar231 = (float)((int)sVar123 >> 8);
  fVar248 = (float)(auVar85._0_4_ >> 0x18);
  fVar249 = (float)(auVar458._8_4_ >> 0x18);
  uVar354 = (undefined1)((uint)uVar20 >> 0x18);
  uVar182 = CONCAT11(uVar354,uVar354);
  uVar354 = (undefined1)((uint)uVar20 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar182,uVar354),CONCAT14(uVar354,uVar20));
  uVar354 = (undefined1)((uint)uVar20 >> 8);
  uVar84 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar354),uVar354);
  sVar123 = CONCAT11((char)uVar20,(char)uVar20);
  uVar116 = CONCAT62(uVar84,sVar123);
  auVar444._8_4_ = 0;
  auVar444._0_8_ = uVar116;
  auVar444._12_2_ = uVar182;
  auVar444._14_2_ = uVar182;
  uVar182 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar443._12_4_ = auVar444._12_4_;
  auVar443._8_2_ = 0;
  auVar443._0_8_ = uVar116;
  auVar443._10_2_ = uVar182;
  auVar442._10_6_ = auVar443._10_6_;
  auVar442._8_2_ = uVar182;
  auVar442._0_8_ = uVar116;
  uVar182 = (undefined2)uVar84;
  auVar86._4_8_ = auVar442._8_8_;
  auVar86._2_2_ = uVar182;
  auVar86._0_2_ = uVar182;
  fVar266 = (float)((int)sVar123 >> 8);
  fVar279 = (float)(auVar86._0_4_ >> 0x18);
  fVar282 = (float)(auVar442._8_4_ >> 0x18);
  uVar354 = (undefined1)((uint)uVar21 >> 0x18);
  uVar182 = CONCAT11(uVar354,uVar354);
  uVar354 = (undefined1)((uint)uVar21 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar182,uVar354),CONCAT14(uVar354,uVar21));
  uVar354 = (undefined1)((uint)uVar21 >> 8);
  uVar84 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar354),uVar354);
  sVar123 = CONCAT11((char)uVar21,(char)uVar21);
  uVar116 = CONCAT62(uVar84,sVar123);
  auVar364._8_4_ = 0;
  auVar364._0_8_ = uVar116;
  auVar364._12_2_ = uVar182;
  auVar364._14_2_ = uVar182;
  uVar182 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar363._12_4_ = auVar364._12_4_;
  auVar363._8_2_ = 0;
  auVar363._0_8_ = uVar116;
  auVar363._10_2_ = uVar182;
  auVar362._10_6_ = auVar363._10_6_;
  auVar362._8_2_ = uVar182;
  auVar362._0_8_ = uVar116;
  uVar182 = (undefined2)uVar84;
  auVar87._4_8_ = auVar362._8_8_;
  auVar87._2_2_ = uVar182;
  auVar87._0_2_ = uVar182;
  fVar456 = (float)((int)sVar123 >> 8);
  fVar462 = (float)(auVar87._0_4_ >> 0x18);
  fVar464 = (float)(auVar362._8_4_ >> 0x18);
  uVar354 = (undefined1)((uint)uVar15 >> 0x18);
  uVar182 = CONCAT11(uVar354,uVar354);
  uVar354 = (undefined1)((uint)uVar15 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar182,uVar354),CONCAT14(uVar354,uVar15));
  uVar354 = (undefined1)((uint)uVar15 >> 8);
  uVar84 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar354),uVar354);
  sVar123 = CONCAT11((char)uVar15,(char)uVar15);
  uVar116 = CONCAT62(uVar84,sVar123);
  auVar344._8_4_ = 0;
  auVar344._0_8_ = uVar116;
  auVar344._12_2_ = uVar182;
  auVar344._14_2_ = uVar182;
  uVar182 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar343._12_4_ = auVar344._12_4_;
  auVar343._8_2_ = 0;
  auVar343._0_8_ = uVar116;
  auVar343._10_2_ = uVar182;
  auVar342._10_6_ = auVar343._10_6_;
  auVar342._8_2_ = uVar182;
  auVar342._0_8_ = uVar116;
  uVar182 = (undefined2)uVar84;
  auVar88._4_8_ = auVar342._8_8_;
  auVar88._2_2_ = uVar182;
  auVar88._0_2_ = uVar182;
  fVar340 = (float)((int)sVar123 >> 8);
  fVar355 = (float)(auVar88._0_4_ >> 0x18);
  fVar357 = (float)(auVar342._8_4_ >> 0x18);
  fVar438 = fVar396 * fVar303 + fVar406 * (float)iVar124 + fVar410 * (float)iVar183;
  fVar450 = fVar396 * fVar309 + fVar406 * fVar389 + fVar410 * fVar425;
  fVar452 = fVar396 * fVar312 + fVar406 * (float)auVar126._8_4_ + fVar410 * (float)auVar127._8_4_;
  fVar454 = fVar396 * (float)(auVar235._12_4_ >> 0x18) +
            fVar406 * (float)auVar367._12_4_ + fVar410 * (float)auVar134._12_4_;
  fVar360 = fVar396 * fVar231 + fVar406 * (float)iVar184 + fVar230;
  fVar373 = fVar396 * fVar248 + fVar406 * fVar327 + fVar247;
  fVar374 = fVar396 * fVar249 + fVar406 * (float)auVar128._8_4_ + auVar232._8_4_;
  fVar377 = fVar396 * (float)(auVar459._12_4_ >> 0x18) +
            fVar406 * (float)auVar138._12_4_ + auVar233._12_4_;
  fVar230 = fVar396 * fVar266 + fVar406 * fVar456 + fVar410 * fVar340;
  fVar247 = fVar396 * fVar279 + fVar406 * fVar462 + fVar410 * fVar355;
  fVar262 = fVar396 * fVar282 + fVar406 * fVar464 + fVar410 * fVar357;
  fVar396 = fVar396 * (float)(auVar443._12_4_ >> 0x18) +
            fVar406 * (float)(auVar363._12_4_ >> 0x18) + fVar410 * (float)(auVar343._12_4_ >> 0x18);
  uVar5 = *(undefined8 *)(prim + uVar110 * 7 + 6);
  uVar6 = *(undefined8 *)(prim + uVar110 * 0xb + 6);
  uVar7 = *(undefined8 *)(prim + uVar110 * 9 + 6);
  uVar8 = *(undefined8 *)(prim + uVar110 * 0xd + 6);
  uVar116 = *(ulong *)(prim + uVar110 * 0x12 + 6);
  fVar406 = fVar303 * fVar189 + (float)iVar124 * fVar223 + (float)iVar183 * fVar226;
  fVar389 = fVar309 * fVar189 + fVar389 * fVar223 + fVar425 * fVar226;
  fVar410 = fVar312 * fVar189 + (float)auVar126._8_4_ * fVar223 + (float)auVar127._8_4_ * fVar226;
  fVar425 = (float)(auVar235._12_4_ >> 0x18) * fVar189 +
            (float)auVar367._12_4_ * fVar223 + (float)auVar134._12_4_ * fVar226;
  fVar397 = fVar231 * fVar189 + (float)iVar184 * fVar223 + fVar265 * fVar226;
  fVar407 = fVar248 * fVar189 + fVar327 * fVar223 + fVar278 * fVar226;
  fVar411 = fVar249 * fVar189 + (float)auVar128._8_4_ * fVar223 + fVar281 * fVar226;
  fVar414 = (float)(auVar459._12_4_ >> 0x18) * fVar189 +
            (float)auVar138._12_4_ * fVar223 + (float)(auVar140._12_4_ >> 0x18) * fVar226;
  fVar456 = fVar189 * fVar266 + fVar223 * fVar456 + fVar226 * fVar340;
  fVar462 = fVar189 * fVar279 + fVar223 * fVar462 + fVar226 * fVar355;
  fVar357 = fVar189 * fVar282 + fVar223 * fVar464 + fVar226 * fVar357;
  fVar464 = fVar189 * (float)(auVar443._12_4_ >> 0x18) +
            fVar223 * (float)(auVar363._12_4_ >> 0x18) + fVar226 * (float)(auVar343._12_4_ >> 0x18);
  auVar285._0_4_ = (float)DAT_01f4bd50;
  fVar189 = DAT_01f4bd50._4_4_;
  fVar223 = DAT_01f4bd50._8_4_;
  auVar288._0_12_ = DAT_01f4bd50._0_12_;
  fVar226 = DAT_01f4bd50._12_4_;
  uVar119 = -(uint)(auVar285._0_4_ <= ABS(fVar438));
  uVar120 = -(uint)(fVar189 <= ABS(fVar450));
  uVar121 = -(uint)(fVar223 <= ABS(fVar452));
  uVar122 = -(uint)(fVar226 <= ABS(fVar454));
  auVar445._0_4_ = (uint)fVar438 & uVar119;
  auVar445._4_4_ = (uint)fVar450 & uVar120;
  auVar445._8_4_ = (uint)fVar452 & uVar121;
  auVar445._12_4_ = (uint)fVar454 & uVar122;
  auVar142._0_4_ = ~uVar119 & (uint)auVar285._0_4_;
  auVar142._4_4_ = ~uVar120 & (uint)fVar189;
  auVar142._8_4_ = ~uVar121 & (uint)fVar223;
  auVar142._12_4_ = ~uVar122 & (uint)fVar226;
  auVar142 = auVar142 | auVar445;
  uVar119 = -(uint)(auVar285._0_4_ <= ABS(fVar360));
  uVar120 = -(uint)(fVar189 <= ABS(fVar373));
  uVar121 = -(uint)(fVar223 <= ABS(fVar374));
  uVar122 = -(uint)(fVar226 <= ABS(fVar377));
  auVar365._0_4_ = (uint)fVar360 & uVar119;
  auVar365._4_4_ = (uint)fVar373 & uVar120;
  auVar365._8_4_ = (uint)fVar374 & uVar121;
  auVar365._12_4_ = (uint)fVar377 & uVar122;
  auVar306._0_4_ = ~uVar119 & (uint)auVar285._0_4_;
  auVar306._4_4_ = ~uVar120 & (uint)fVar189;
  auVar306._8_4_ = ~uVar121 & (uint)fVar223;
  auVar306._12_4_ = ~uVar122 & (uint)fVar226;
  auVar306 = auVar306 | auVar365;
  uVar119 = -(uint)(auVar285._0_4_ <= ABS(fVar230));
  uVar120 = -(uint)(fVar189 <= ABS(fVar247));
  uVar121 = -(uint)(fVar223 <= ABS(fVar262));
  uVar122 = -(uint)(fVar226 <= ABS(fVar396));
  auVar251._0_4_ = (uint)fVar230 & uVar119;
  auVar251._4_4_ = (uint)fVar247 & uVar120;
  auVar251._8_4_ = (uint)fVar262 & uVar121;
  auVar251._12_4_ = (uint)fVar396 & uVar122;
  auVar446._0_4_ = ~uVar119 & (uint)auVar285._0_4_;
  auVar446._4_4_ = ~uVar120 & (uint)fVar189;
  auVar446._8_4_ = ~uVar121 & (uint)fVar223;
  auVar446._12_4_ = ~uVar122 & (uint)fVar226;
  auVar446 = auVar446 | auVar251;
  auVar252 = rcpps(auVar251,auVar142);
  auVar253._0_4_ = auVar252._0_4_;
  auVar143._0_4_ = auVar142._0_4_ * auVar253._0_4_;
  fVar309 = auVar252._4_4_;
  auVar143._4_4_ = auVar142._4_4_ * fVar309;
  fVar312 = auVar252._8_4_;
  auVar143._8_4_ = auVar142._8_4_ * fVar312;
  fVar327 = auVar252._12_4_;
  auVar143._12_4_ = auVar142._12_4_ * fVar327;
  fVar355 = (1.0 - auVar143._0_4_) * auVar253._0_4_ + auVar253._0_4_;
  fVar309 = (1.0 - auVar143._4_4_) * fVar309 + fVar309;
  fVar312 = (1.0 - auVar143._8_4_) * fVar312 + fVar312;
  fVar327 = (1.0 - auVar143._12_4_) * fVar327 + fVar327;
  auVar144 = rcpps(auVar143,auVar306);
  fVar189 = auVar144._0_4_;
  fVar223 = auVar144._4_4_;
  fVar262 = auVar144._8_4_;
  fVar279 = auVar144._12_4_;
  fVar189 = (1.0 - auVar306._0_4_ * fVar189) * fVar189 + fVar189;
  fVar223 = (1.0 - auVar306._4_4_ * fVar223) * fVar223 + fVar223;
  fVar262 = (1.0 - auVar306._8_4_ * fVar262) * fVar262 + fVar262;
  fVar279 = (1.0 - auVar306._12_4_ * fVar279) * fVar279 + fVar279;
  auVar144 = rcpps(auVar144,auVar446);
  auVar145._0_4_ = auVar144._0_4_;
  fVar226 = auVar144._4_4_;
  fVar396 = auVar144._8_4_;
  fVar281 = auVar144._12_4_;
  uVar9 = *(undefined8 *)(prim + uVar110 * 0x16 + 6);
  fVar340 = (1.0 - auVar446._0_4_ * auVar145._0_4_) * auVar145._0_4_ + auVar145._0_4_;
  fVar226 = (1.0 - auVar446._4_4_ * fVar226) * fVar226 + fVar226;
  fVar396 = (1.0 - auVar446._8_4_ * fVar396) * fVar396 + fVar396;
  fVar281 = (1.0 - auVar446._12_4_ * fVar281) * fVar281 + fVar281;
  local_548.lower._0_2_ = (short)uVar5;
  local_548.lower._2_2_ = (undefined2)((ulong)uVar5 >> 0x10);
  local_548.upper._0_2_ = (undefined2)((ulong)uVar5 >> 0x20);
  local_548.upper._2_2_ = (undefined2)((ulong)uVar5 >> 0x30);
  auVar148._0_12_ = auVar144._0_12_;
  auVar148._12_2_ = auVar144._6_2_;
  auVar148._14_2_ = local_548.upper._2_2_;
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._0_10_ = auVar144._0_10_;
  auVar147._10_2_ = local_548.upper._0_2_;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._0_8_ = auVar144._0_8_;
  auVar146._8_2_ = auVar144._4_2_;
  auVar145._8_8_ = auVar146._8_8_;
  auVar145._6_2_ = local_548.lower._2_2_;
  auVar145._4_2_ = auVar144._2_2_;
  auVar149._0_4_ = (float)(int)local_548.lower._0_2_;
  fVar230 = (float)(auVar145._4_4_ >> 0x10);
  auVar129._0_8_ = CONCAT44(fVar230,auVar149._0_4_);
  auVar129._8_4_ = (float)(auVar146._8_4_ >> 0x10);
  p00_1.field_0.i[0]._0_2_ = (undefined2)uVar6;
  p00_1.field_0.i[0]._2_2_ = (undefined2)((ulong)uVar6 >> 0x10);
  p00_1.field_0.i[1]._0_2_ = (undefined2)((ulong)uVar6 >> 0x20);
  p00_1.field_0.i[1]._2_2_ = (undefined2)((ulong)uVar6 >> 0x30);
  auVar256._0_12_ = auVar252._0_12_;
  auVar256._12_2_ = auVar252._6_2_;
  auVar256._14_2_ = p00_1.field_0.i[1]._2_2_;
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._0_10_ = auVar252._0_10_;
  auVar255._10_2_ = p00_1.field_0.i[1]._0_2_;
  auVar254._10_6_ = auVar255._10_6_;
  auVar254._0_8_ = auVar252._0_8_;
  auVar254._8_2_ = auVar252._4_2_;
  auVar253._8_8_ = auVar254._8_8_;
  auVar253._6_2_ = p00_1.field_0.i[0]._2_2_;
  auVar253._4_2_ = auVar252._2_2_;
  auVar152._12_2_ = (short)((uint)fVar230 >> 0x10);
  auVar152._0_12_ = auVar129;
  auVar152._14_2_ = (short)((ulong)uVar7 >> 0x30);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_10_ = auVar129._0_10_;
  auVar151._10_2_ = (short)((ulong)uVar7 >> 0x20);
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = SUB42(fVar230,0);
  auVar150._0_8_ = auVar129._0_8_;
  auVar149._8_8_ = auVar150._8_8_;
  auVar149._6_2_ = (short)((ulong)uVar7 >> 0x10);
  auVar149._4_2_ = (short)((uint)auVar149._0_4_ >> 0x10);
  auVar153._0_4_ = (float)(int)(short)uVar7;
  fVar231 = (float)(auVar149._4_4_ >> 0x10);
  auVar130._0_8_ = CONCAT44(fVar231,auVar153._0_4_);
  auVar130._8_4_ = (float)(auVar150._8_4_ >> 0x10);
  auVar288._12_2_ = DAT_01f4bd50._6_2_;
  auVar288._14_2_ = (short)((ulong)uVar8 >> 0x30);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._0_10_ = (unkbyte10)DAT_01f4bd50;
  auVar287._10_2_ = (short)((ulong)uVar8 >> 0x20);
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._0_8_ = (undefined8)DAT_01f4bd50;
  auVar286._8_2_ = DAT_01f4bd50._4_2_;
  auVar285._8_8_ = auVar286._8_8_;
  auVar285._6_2_ = (short)((ulong)uVar8 >> 0x10);
  auVar285._4_2_ = DAT_01f4bd50._2_2_;
  uVar225 = (undefined2)(uVar116 >> 0x30);
  auVar156._12_2_ = (short)((uint)fVar231 >> 0x10);
  auVar156._0_12_ = auVar130;
  auVar156._14_2_ = uVar225;
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar130._0_10_;
  uVar222 = (undefined2)(uVar116 >> 0x20);
  auVar155._10_2_ = uVar222;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._8_2_ = SUB42(fVar231,0);
  auVar154._0_8_ = auVar130._0_8_;
  auVar153._8_8_ = auVar154._8_8_;
  uVar182 = (undefined2)(uVar116 >> 0x10);
  auVar153._6_2_ = uVar182;
  auVar153._4_2_ = (short)((uint)auVar153._0_4_ >> 0x10);
  fVar247 = (float)(auVar153._4_4_ >> 0x10);
  fVar265 = (float)(auVar154._8_4_ >> 0x10);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar116;
  auVar193._12_2_ = uVar225;
  auVar193._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar116;
  auVar192._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar222;
  auVar191._0_8_ = uVar116;
  auVar89._4_8_ = auVar191._8_8_;
  auVar89._2_2_ = (short)((ulong)uVar9 >> 0x10);
  auVar89._0_2_ = uVar182;
  uVar111 = *(ulong *)(prim + uVar110 * 0x14 + 6);
  uVar182 = (undefined2)(uVar111 >> 0x30);
  auVar159._8_4_ = 0;
  auVar159._0_8_ = uVar111;
  auVar159._12_2_ = uVar182;
  auVar159._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar111 >> 0x20);
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._8_2_ = 0;
  auVar158._0_8_ = uVar111;
  auVar158._10_2_ = uVar182;
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._8_2_ = uVar182;
  auVar157._0_8_ = uVar111;
  uVar182 = (undefined2)(uVar111 >> 0x10);
  auVar90._4_8_ = auVar157._8_8_;
  auVar90._2_2_ = uVar182;
  auVar90._0_2_ = uVar182;
  fVar248 = (float)(auVar90._0_4_ >> 0x10);
  fVar266 = (float)(auVar157._8_4_ >> 0x10);
  uVar117 = *(ulong *)(prim + uVar110 * 0x18 + 6);
  uVar182 = (undefined2)(uVar117 >> 0x30);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar117;
  auVar196._12_2_ = uVar182;
  auVar196._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar117 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar117;
  auVar195._10_2_ = uVar182;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar182;
  auVar194._0_8_ = uVar117;
  uVar182 = (undefined2)(uVar117 >> 0x10);
  auVar91._4_8_ = auVar194._8_8_;
  auVar91._2_2_ = uVar182;
  auVar91._0_2_ = uVar182;
  uVar10 = *(ulong *)(prim + uVar110 * 0x1d + 6);
  uVar182 = (undefined2)(uVar10 >> 0x30);
  auVar162._8_4_ = 0;
  auVar162._0_8_ = uVar10;
  auVar162._12_2_ = uVar182;
  auVar162._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar10 >> 0x20);
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._8_2_ = 0;
  auVar161._0_8_ = uVar10;
  auVar161._10_2_ = uVar182;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._8_2_ = uVar182;
  auVar160._0_8_ = uVar10;
  uVar182 = (undefined2)(uVar10 >> 0x10);
  auVar92._4_8_ = auVar160._8_8_;
  auVar92._2_2_ = uVar182;
  auVar92._0_2_ = uVar182;
  fVar249 = (float)(auVar92._0_4_ >> 0x10);
  fVar278 = (float)(auVar160._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar110 * 0x21 + 6);
  uVar182 = (undefined2)(uVar11 >> 0x30);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar11;
  auVar199._12_2_ = uVar182;
  auVar199._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar11 >> 0x20);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._8_2_ = 0;
  auVar198._0_8_ = uVar11;
  auVar198._10_2_ = uVar182;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = uVar182;
  auVar197._0_8_ = uVar11;
  uVar182 = (undefined2)(uVar11 >> 0x10);
  auVar93._4_8_ = auVar197._8_8_;
  auVar93._2_2_ = uVar182;
  auVar93._0_2_ = uVar182;
  uVar12 = *(ulong *)(prim + uVar110 * 0x1f + 6);
  uVar182 = (undefined2)(uVar12 >> 0x30);
  auVar165._8_4_ = 0;
  auVar165._0_8_ = uVar12;
  auVar165._12_2_ = uVar182;
  auVar165._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar12 >> 0x20);
  auVar164._12_4_ = auVar165._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar12;
  auVar164._10_2_ = uVar182;
  auVar163._10_6_ = auVar164._10_6_;
  auVar163._8_2_ = uVar182;
  auVar163._0_8_ = uVar12;
  uVar182 = (undefined2)(uVar12 >> 0x10);
  auVar94._4_8_ = auVar163._8_8_;
  auVar94._2_2_ = uVar182;
  auVar94._0_2_ = uVar182;
  fVar282 = (float)(auVar94._0_4_ >> 0x10);
  fVar303 = (float)(auVar163._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar110 * 0x23 + 6);
  uVar182 = (undefined2)(uVar13 >> 0x30);
  auVar168._8_4_ = 0;
  auVar168._0_8_ = uVar13;
  auVar168._12_2_ = uVar182;
  auVar168._14_2_ = uVar182;
  uVar182 = (undefined2)(uVar13 >> 0x20);
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._8_2_ = 0;
  auVar167._0_8_ = uVar13;
  auVar167._10_2_ = uVar182;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._8_2_ = uVar182;
  auVar166._0_8_ = uVar13;
  uVar182 = (undefined2)(uVar13 >> 0x10);
  auVar95._4_8_ = auVar166._8_8_;
  auVar95._2_2_ = uVar182;
  auVar95._0_2_ = uVar182;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar257._0_8_ =
       CONCAT44(((((float)(auVar253._4_4_ >> 0x10) - fVar230) * fVar188 + fVar230) - fVar389) *
                fVar309,((((float)(int)(short)p00_1.field_0.i[0]._0_2_ - auVar149._0_4_) * fVar188 +
                         auVar149._0_4_) - fVar406) * fVar355);
  auVar257._8_4_ =
       ((((float)(auVar254._8_4_ >> 0x10) - auVar129._8_4_) * fVar188 + auVar129._8_4_) - fVar410) *
       fVar312;
  auVar257._12_4_ =
       ((((float)(auVar255._12_4_ >> 0x10) - (float)(auVar147._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar147._12_4_ >> 0x10)) - fVar425) * fVar327;
  auVar289._0_4_ =
       ((((float)(int)(short)uVar8 - auVar153._0_4_) * fVar188 + auVar153._0_4_) - fVar406) *
       fVar355;
  auVar289._4_4_ =
       ((((float)(auVar285._4_4_ >> 0x10) - fVar231) * fVar188 + fVar231) - fVar389) * fVar309;
  auVar289._8_4_ =
       ((((float)(auVar286._8_4_ >> 0x10) - auVar130._8_4_) * fVar188 + auVar130._8_4_) - fVar410) *
       fVar312;
  auVar289._12_4_ =
       ((((float)(auVar287._12_4_ >> 0x10) - (float)(auVar151._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar151._12_4_ >> 0x10)) - fVar425) * fVar327;
  auVar307._0_8_ =
       CONCAT44(((((float)(auVar89._0_4_ >> 0x10) - fVar247) * fVar188 + fVar247) - fVar407) *
                fVar223,((((float)(int)(short)uVar9 - (float)(int)(short)uVar116) * fVar188 +
                         (float)(int)(short)uVar116) - fVar397) * fVar189);
  auVar307._8_4_ =
       ((((float)(auVar191._8_4_ >> 0x10) - fVar265) * fVar188 + fVar265) - fVar411) * fVar262;
  auVar307._12_4_ =
       ((((float)(auVar192._12_4_ >> 0x10) - (float)(auVar155._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar155._12_4_ >> 0x10)) - fVar414) * fVar279;
  auVar383._0_4_ =
       ((((float)(int)(short)uVar117 - (float)(int)(short)uVar111) * fVar188 +
        (float)(int)(short)uVar111) - fVar397) * fVar189;
  auVar383._4_4_ =
       ((((float)(auVar91._0_4_ >> 0x10) - fVar248) * fVar188 + fVar248) - fVar407) * fVar223;
  auVar383._8_4_ =
       ((((float)(auVar194._8_4_ >> 0x10) - fVar266) * fVar188 + fVar266) - fVar411) * fVar262;
  auVar383._12_4_ =
       ((((float)(auVar195._12_4_ >> 0x10) - (float)(auVar158._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar158._12_4_ >> 0x10)) - fVar414) * fVar279;
  auVar400._0_8_ =
       CONCAT44(((((float)(auVar93._0_4_ >> 0x10) - fVar249) * fVar188 + fVar249) - fVar462) *
                fVar226,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar188 +
                         (float)(int)(short)uVar10) - fVar456) * fVar340);
  auVar400._8_4_ =
       ((((float)(auVar197._8_4_ >> 0x10) - fVar278) * fVar188 + fVar278) - fVar357) * fVar396;
  auVar400._12_4_ =
       ((((float)(auVar198._12_4_ >> 0x10) - (float)(auVar161._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar161._12_4_ >> 0x10)) - fVar464) * fVar281;
  auVar421._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar188 +
        (float)(int)(short)uVar12) - fVar456) * fVar340;
  auVar421._4_4_ =
       ((((float)(auVar95._0_4_ >> 0x10) - fVar282) * fVar188 + fVar282) - fVar462) * fVar226;
  auVar421._8_4_ =
       ((((float)(auVar166._8_4_ >> 0x10) - fVar303) * fVar188 + fVar303) - fVar357) * fVar396;
  auVar421._12_4_ =
       ((((float)(auVar167._12_4_ >> 0x10) - (float)(auVar164._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar164._12_4_ >> 0x10)) - fVar464) * fVar281;
  auVar237._8_4_ = auVar257._8_4_;
  auVar237._0_8_ = auVar257._0_8_;
  auVar237._12_4_ = auVar257._12_4_;
  auVar252 = minps(auVar237,auVar289);
  auVar200._8_4_ = auVar307._8_4_;
  auVar200._0_8_ = auVar307._0_8_;
  auVar200._12_4_ = auVar307._12_4_;
  auVar144 = minps(auVar200,auVar383);
  auVar252 = maxps(auVar252,auVar144);
  auVar201._8_4_ = auVar400._8_4_;
  auVar201._0_8_ = auVar400._0_8_;
  auVar201._12_4_ = auVar400._12_4_;
  auVar144 = minps(auVar201,auVar421);
  auVar169._4_4_ = uVar4;
  auVar169._0_4_ = uVar4;
  auVar169._8_4_ = uVar4;
  auVar169._12_4_ = uVar4;
  auVar144 = maxps(auVar144,auVar169);
  auVar144 = maxps(auVar252,auVar144);
  fVar189 = auVar144._0_4_ * 0.99999964;
  fVar223 = auVar144._4_4_ * 0.99999964;
  fVar226 = auVar144._8_4_ * 0.99999964;
  fVar230 = auVar144._12_4_ * 0.99999964;
  auVar144 = maxps(auVar257,auVar289);
  auVar252 = maxps(auVar307,auVar383);
  auVar144 = minps(auVar144,auVar252);
  auVar252 = maxps(auVar400,auVar421);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar202._4_4_ = uVar4;
  auVar202._0_4_ = uVar4;
  auVar202._8_4_ = uVar4;
  auVar202._12_4_ = uVar4;
  auVar252 = minps(auVar252,auVar202);
  auVar144 = minps(auVar144,auVar252);
  auVar203._0_4_ = -(uint)(PVar14 != (Primitive)0x0 && fVar189 <= auVar144._0_4_ * 1.0000004);
  auVar203._4_4_ = -(uint)(1 < (byte)PVar14 && fVar223 <= auVar144._4_4_ * 1.0000004);
  auVar203._8_4_ = -(uint)(2 < (byte)PVar14 && fVar226 <= auVar144._8_4_ * 1.0000004);
  auVar203._12_4_ = -(uint)(3 < (byte)PVar14 && fVar230 <= auVar144._12_4_ * 1.0000004);
  uVar119 = movmskps((int)(uVar110 * 0x23),auVar203);
  local_3a0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar29 = (int)mm_lookupmask_ps._240_4_ < 0;
  bVar30 = (int)mm_lookupmask_ps._244_4_ < 0;
  bVar31 = (int)mm_lookupmask_ps._248_4_ < 0;
  local_398 = prim;
LAB_0039090b:
  uVar116 = (ulong)uVar119;
  if (uVar116 == 0) {
    return;
  }
  lVar114 = 0;
  if (uVar116 != 0) {
    for (; (uVar119 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
    }
  }
  uVar119 = *(uint *)(local_398 + 2);
  uVar120 = *(uint *)(local_398 + lVar114 * 4 + 6);
  pGVar22 = (context->scene->geometries).items[uVar119].ptr;
  fVar231 = pGVar22->fnumTimeSegments;
  fVar247 = (pGVar22->time_range).lower;
  fVar248 = ((*(float *)(ray + k * 4 + 0x70) - fVar247) / ((pGVar22->time_range).upper - fVar247)) *
            fVar231;
  fVar247 = floorf(fVar248);
  fVar231 = fVar231 + -1.0;
  if (fVar231 <= fVar247) {
    fVar247 = fVar231;
  }
  fVar231 = 0.0;
  if (0.0 <= fVar247) {
    fVar231 = fVar247;
  }
  uVar111 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                            (ulong)uVar120 *
                            pGVar22[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var23 = pGVar22[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar115 = (long)(int)fVar231 * 0x38;
  lVar24 = *(long *)(_Var23 + lVar115);
  lVar25 = *(long *)(_Var23 + 0x10 + lVar115);
  pfVar3 = (float *)(lVar24 + lVar25 * uVar111);
  fVar247 = *pfVar3;
  fVar249 = pfVar3[1];
  fVar262 = pfVar3[2];
  fVar396 = pfVar3[3];
  lVar114 = uVar111 + 1;
  pfVar3 = (float *)(lVar24 + lVar25 * lVar114);
  fVar265 = *pfVar3;
  fVar266 = pfVar3[1];
  fVar278 = pfVar3[2];
  fVar279 = pfVar3[3];
  lVar1 = uVar111 + 2;
  pfVar3 = (float *)(lVar24 + lVar25 * lVar1);
  fVar281 = *pfVar3;
  fVar188 = pfVar3[1];
  fVar282 = pfVar3[2];
  fVar303 = pfVar3[3];
  lVar2 = uVar111 + 3;
  pfVar3 = (float *)(lVar24 + lVar25 * lVar2);
  fVar309 = *pfVar3;
  fVar312 = pfVar3[1];
  fVar327 = pfVar3[2];
  fVar406 = pfVar3[3];
  lVar24 = *(long *)&pGVar22[4].fnumTimeSegments;
  lVar25 = *(long *)(lVar24 + lVar115);
  lVar26 = *(long *)(lVar24 + 0x10 + lVar115);
  pfVar3 = (float *)(lVar25 + lVar26 * uVar111);
  fVar389 = *pfVar3;
  fVar410 = pfVar3[1];
  fVar425 = pfVar3[2];
  fVar340 = pfVar3[3];
  pfVar3 = (float *)(lVar25 + lVar26 * lVar114);
  fVar355 = *pfVar3;
  fVar357 = pfVar3[1];
  fVar360 = pfVar3[2];
  fVar373 = pfVar3[3];
  pfVar3 = (float *)(lVar25 + lVar26 * lVar1);
  fVar374 = *pfVar3;
  fVar377 = pfVar3[1];
  fVar397 = pfVar3[2];
  fVar407 = pfVar3[3];
  fVar248 = fVar248 - fVar231;
  pfVar3 = (float *)(lVar25 + lVar26 * lVar2);
  fVar231 = *pfVar3;
  fVar411 = pfVar3[1];
  fVar414 = pfVar3[2];
  fVar456 = pfVar3[3];
  fVar462 = fVar247 * 0.16666667 + fVar265 * 0.6666667 + fVar281 * 0.16666667 + fVar309 * 0.0;
  fVar438 = fVar249 * 0.16666667 + fVar266 * 0.6666667 + fVar188 * 0.16666667 + fVar312 * 0.0;
  fVar452 = fVar262 * 0.16666667 + fVar278 * 0.6666667 + fVar282 * 0.16666667 + fVar327 * 0.0;
  fVar187 = fVar396 * 0.16666667 + fVar279 * 0.6666667 + fVar303 * 0.16666667 + fVar406 * 0.0;
  fVar250 = ((fVar281 * 0.5 + fVar309 * 0.0) - fVar265 * 0.0) - fVar247 * 0.5;
  fVar261 = ((fVar188 * 0.5 + fVar312 * 0.0) - fVar266 * 0.0) - fVar249 * 0.5;
  fVar263 = ((fVar282 * 0.5 + fVar327 * 0.0) - fVar278 * 0.0) - fVar262 * 0.5;
  fVar264 = ((fVar303 * 0.5 + fVar406 * 0.0) - fVar279 * 0.0) - fVar396 * 0.5;
  fVar418 = fVar389 * 0.16666667 + fVar355 * 0.6666667 + fVar374 * 0.16666667 + fVar231 * 0.0;
  fVar426 = fVar410 * 0.16666667 + fVar357 * 0.6666667 + fVar377 * 0.16666667 + fVar411 * 0.0;
  fVar428 = fVar425 * 0.16666667 + fVar360 * 0.6666667 + fVar397 * 0.16666667 + fVar414 * 0.0;
  fVar430 = fVar340 * 0.16666667 + fVar373 * 0.6666667 + fVar407 * 0.16666667 + fVar456 * 0.0;
  fVar464 = ((fVar374 * 0.5 + fVar231 * 0.0) - fVar355 * 0.0) - fVar389 * 0.5;
  fVar450 = ((fVar377 * 0.5 + fVar411 * 0.0) - fVar357 * 0.0) - fVar410 * 0.5;
  fVar454 = ((fVar397 * 0.5 + fVar414 * 0.0) - fVar360 * 0.0) - fVar425 * 0.5;
  fVar415 = ((fVar407 * 0.5 + fVar456 * 0.0) - fVar373 * 0.0) - fVar340 * 0.5;
  fVar267 = fVar265 * 0.16666667 + fVar281 * 0.6666667 + fVar309 * 0.16666667 + fVar247 * 0.0;
  fVar280 = fVar266 * 0.16666667 + fVar188 * 0.6666667 + fVar312 * 0.16666667 + fVar249 * 0.0;
  fVar283 = fVar278 * 0.16666667 + fVar282 * 0.6666667 + fVar327 * 0.16666667 + fVar262 * 0.0;
  fVar284 = fVar279 * 0.16666667 + fVar303 * 0.6666667 + fVar406 * 0.16666667 + fVar396 * 0.0;
  fVar190 = ((fVar281 * 0.0 + fVar309 * 0.5) - fVar265 * 0.5) - fVar247 * 0.0;
  fVar224 = ((fVar188 * 0.0 + fVar312 * 0.5) - fVar266 * 0.5) - fVar249 * 0.0;
  fVar227 = ((fVar282 * 0.0 + fVar327 * 0.5) - fVar278 * 0.5) - fVar262 * 0.0;
  fVar228 = ((fVar303 * 0.0 + fVar406 * 0.5) - fVar279 * 0.5) - fVar396 * 0.0;
  fVar262 = fVar355 * 0.16666667 + fVar374 * 0.6666667 + fVar231 * 0.16666667 + fVar389 * 0.0;
  fVar396 = fVar357 * 0.16666667 + fVar377 * 0.6666667 + fVar411 * 0.16666667 + fVar410 * 0.0;
  fVar265 = fVar360 * 0.16666667 + fVar397 * 0.6666667 + fVar414 * 0.16666667 + fVar425 * 0.0;
  fVar266 = fVar373 * 0.16666667 + fVar407 * 0.6666667 + fVar456 * 0.16666667 + fVar340 * 0.0;
  fVar231 = ((fVar374 * 0.0 + fVar231 * 0.5) - fVar355 * 0.5) - fVar389 * 0.0;
  fVar247 = ((fVar377 * 0.0 + fVar411 * 0.5) - fVar357 * 0.5) - fVar410 * 0.0;
  fVar249 = ((fVar397 * 0.0 + fVar414 * 0.5) - fVar360 * 0.5) - fVar425 * 0.0;
  fVar389 = ((fVar407 * 0.0 + fVar456 * 0.5) - fVar373 * 0.5) - fVar340 * 0.0;
  fVar432 = fVar261 * fVar418 - fVar426 * fVar250;
  fVar436 = fVar263 * fVar426 - fVar428 * fVar261;
  fVar428 = fVar250 * fVar428 - fVar418 * fVar263;
  fVar437 = fVar264 * fVar430 - fVar430 * fVar264;
  fVar340 = fVar261 * fVar464 - fVar450 * fVar250;
  fVar357 = fVar263 * fVar450 - fVar454 * fVar261;
  fVar360 = fVar250 * fVar454 - fVar464 * fVar263;
  fVar397 = fVar224 * fVar262 - fVar396 * fVar190;
  fVar407 = fVar227 * fVar396 - fVar265 * fVar224;
  fVar411 = fVar190 * fVar265 - fVar262 * fVar227;
  fVar414 = fVar228 * fVar266 - fVar266 * fVar228;
  fVar373 = fVar224 * fVar231 - fVar247 * fVar190;
  fVar374 = fVar227 * fVar247 - fVar249 * fVar224;
  fVar377 = fVar190 * fVar249 - fVar231 * fVar227;
  fVar406 = fVar428 * fVar428 + fVar436 * fVar436 + fVar432 * fVar432;
  auVar144 = ZEXT416((uint)fVar406);
  auVar252 = rsqrtss(ZEXT416((uint)fVar406),auVar144);
  fVar231 = auVar252._0_4_;
  fVar456 = fVar231 * 1.5 - fVar231 * fVar231 * fVar406 * 0.5 * fVar231;
  fVar426 = fVar432 * fVar340 + fVar428 * fVar360 + fVar436 * fVar357;
  fVar425 = fVar437 * fVar456;
  auVar144 = rcpss(auVar144,auVar144);
  fVar355 = (2.0 - fVar406 * auVar144._0_4_) * auVar144._0_4_;
  fVar419 = fVar411 * fVar411 + fVar407 * fVar407 + fVar397 * fVar397;
  auVar252 = ZEXT416((uint)fVar419);
  auVar144 = rsqrtss(ZEXT416((uint)fVar419),auVar252);
  fVar231 = auVar144._0_4_;
  fVar430 = fVar231 * 1.5 - fVar231 * fVar231 * fVar419 * 0.5 * fVar231;
  fVar439 = fVar397 * fVar373 + fVar411 * fVar377 + fVar407 * fVar374;
  lVar25 = *(long *)(_Var23 + 0x38 + lVar115);
  lVar26 = *(long *)(_Var23 + 0x48 + lVar115);
  pfVar3 = (float *)(lVar25 + lVar26 * uVar111);
  fVar231 = *pfVar3;
  fVar247 = pfVar3[1];
  fVar249 = pfVar3[2];
  fVar262 = pfVar3[3];
  pfVar3 = (float *)(lVar25 + lVar26 * lVar114);
  fVar396 = *pfVar3;
  fVar265 = pfVar3[1];
  fVar266 = pfVar3[2];
  fVar278 = pfVar3[3];
  pfVar3 = (float *)(lVar25 + lVar26 * lVar1);
  fVar279 = *pfVar3;
  fVar281 = pfVar3[1];
  fVar188 = pfVar3[2];
  fVar282 = pfVar3[3];
  auVar144 = rcpss(auVar252,auVar252);
  pfVar3 = (float *)(lVar25 + lVar26 * lVar2);
  fVar303 = *pfVar3;
  fVar309 = pfVar3[1];
  fVar312 = pfVar3[2];
  fVar327 = pfVar3[3];
  lVar25 = *(long *)(lVar24 + 0x38 + lVar115);
  lVar24 = *(long *)(lVar24 + 0x48 + lVar115);
  fVar410 = fVar414 * fVar430;
  fVar440 = (2.0 - fVar419 * auVar144._0_4_) * auVar144._0_4_;
  fVar464 = fVar187 * fVar436 * fVar456;
  fVar450 = fVar187 * fVar428 * fVar456;
  fVar454 = fVar187 * fVar432 * fVar456;
  fVar418 = fVar187 * fVar425;
  fVar304 = fVar462 - fVar464;
  fVar310 = fVar438 - fVar450;
  fVar313 = fVar452 - fVar454;
  fVar315 = fVar187 - fVar418;
  fVar398 = fVar187 * fVar355 * (fVar406 * fVar357 - fVar426 * fVar436) * fVar456 +
            fVar264 * fVar436 * fVar456;
  fVar408 = fVar187 * fVar355 * (fVar406 * fVar360 - fVar426 * fVar428) * fVar456 +
            fVar264 * fVar428 * fVar456;
  fVar412 = fVar187 * fVar355 * (fVar406 * fVar340 - fVar426 * fVar432) * fVar456 +
            fVar264 * fVar432 * fVar456;
  fVar416 = fVar187 * fVar355 * (fVar406 * (fVar264 * fVar415 - fVar415 * fVar264) -
                                fVar426 * fVar437) * fVar456 + fVar264 * fVar425;
  fVar464 = fVar464 + fVar462;
  fVar450 = fVar450 + fVar438;
  fVar454 = fVar454 + fVar452;
  fVar418 = fVar418 + fVar187;
  fVar462 = fVar284 * fVar407 * fVar430;
  fVar438 = fVar284 * fVar411 * fVar430;
  fVar452 = fVar284 * fVar397 * fVar430;
  fVar187 = fVar284 * fVar410;
  fVar317 = fVar267 - fVar462;
  fVar328 = fVar280 - fVar438;
  fVar332 = fVar283 - fVar452;
  fVar336 = fVar284 - fVar187;
  fVar415 = fVar284 * fVar440 * (fVar419 * fVar374 - fVar439 * fVar407) * fVar430 +
            fVar228 * fVar407 * fVar430;
  fVar426 = fVar284 * fVar440 * (fVar419 * fVar377 - fVar439 * fVar411) * fVar430 +
            fVar228 * fVar411 * fVar430;
  fVar428 = fVar284 * fVar440 * (fVar419 * fVar373 - fVar439 * fVar397) * fVar430 +
            fVar228 * fVar397 * fVar430;
  fVar430 = fVar284 * fVar440 * (fVar419 * (fVar228 * fVar389 - fVar389 * fVar228) -
                                fVar439 * fVar414) * fVar430 + fVar228 * fVar410;
  fVar462 = fVar462 + fVar267;
  fVar438 = fVar438 + fVar280;
  fVar452 = fVar452 + fVar283;
  fVar187 = fVar187 + fVar284;
  fVar318 = fVar231 * 0.16666667 + fVar396 * 0.6666667 + fVar279 * 0.16666667 + fVar303 * 0.0;
  fVar329 = fVar247 * 0.16666667 + fVar265 * 0.6666667 + fVar281 * 0.16666667 + fVar309 * 0.0;
  fVar333 = fVar249 * 0.16666667 + fVar266 * 0.6666667 + fVar188 * 0.16666667 + fVar312 * 0.0;
  fVar337 = fVar262 * 0.16666667 + fVar278 * 0.6666667 + fVar282 * 0.16666667 + fVar327 * 0.0;
  fVar267 = ((fVar279 * 0.5 + fVar303 * 0.0) - fVar396 * 0.0) - fVar231 * 0.5;
  fVar280 = ((fVar281 * 0.5 + fVar309 * 0.0) - fVar265 * 0.0) - fVar247 * 0.5;
  fVar283 = ((fVar188 * 0.5 + fVar312 * 0.0) - fVar266 * 0.0) - fVar249 * 0.5;
  fVar284 = ((fVar282 * 0.5 + fVar327 * 0.0) - fVar278 * 0.0) - fVar262 * 0.5;
  pfVar3 = (float *)(lVar25 + lVar24 * lVar2);
  fVar406 = *pfVar3;
  fVar389 = pfVar3[1];
  fVar410 = pfVar3[2];
  fVar425 = pfVar3[3];
  pfVar3 = (float *)(lVar25 + lVar1 * lVar24);
  fVar340 = *pfVar3;
  fVar355 = pfVar3[1];
  fVar357 = pfVar3[2];
  fVar360 = pfVar3[3];
  pfVar3 = (float *)(lVar25 + lVar114 * lVar24);
  fVar373 = *pfVar3;
  fVar374 = pfVar3[1];
  fVar377 = pfVar3[2];
  fVar397 = pfVar3[3];
  pfVar3 = (float *)(lVar25 + uVar111 * lVar24);
  fVar407 = *pfVar3;
  fVar411 = pfVar3[1];
  fVar414 = pfVar3[2];
  fVar456 = pfVar3[3];
  fVar319 = fVar407 * 0.16666667 + fVar373 * 0.6666667 + fVar340 * 0.16666667 + fVar406 * 0.0;
  fVar330 = fVar411 * 0.16666667 + fVar374 * 0.6666667 + fVar355 * 0.16666667 + fVar389 * 0.0;
  fVar334 = fVar414 * 0.16666667 + fVar377 * 0.6666667 + fVar357 * 0.16666667 + fVar410 * 0.0;
  fVar338 = fVar456 * 0.16666667 + fVar397 * 0.6666667 + fVar360 * 0.16666667 + fVar425 * 0.0;
  fVar439 = ((fVar340 * 0.5 + fVar406 * 0.0) - fVar373 * 0.0) - fVar407 * 0.5;
  fVar440 = ((fVar355 * 0.5 + fVar389 * 0.0) - fVar374 * 0.0) - fVar411 * 0.5;
  fVar300 = ((fVar357 * 0.5 + fVar410 * 0.0) - fVar377 * 0.0) - fVar414 * 0.5;
  fVar301 = ((fVar360 * 0.5 + fVar425 * 0.0) - fVar397 * 0.0) - fVar456 * 0.5;
  fVar419 = fVar396 * 0.16666667 + fVar279 * 0.6666667 + fVar303 * 0.16666667 + fVar231 * 0.0;
  fVar432 = fVar265 * 0.16666667 + fVar281 * 0.6666667 + fVar309 * 0.16666667 + fVar247 * 0.0;
  fVar436 = fVar266 * 0.16666667 + fVar188 * 0.6666667 + fVar312 * 0.16666667 + fVar249 * 0.0;
  fVar437 = fVar278 * 0.16666667 + fVar282 * 0.6666667 + fVar327 * 0.16666667 + fVar262 * 0.0;
  fVar396 = ((fVar279 * 0.0 + fVar303 * 0.5) - fVar396 * 0.5) - fVar231 * 0.0;
  fVar265 = ((fVar281 * 0.0 + fVar309 * 0.5) - fVar265 * 0.5) - fVar247 * 0.0;
  fVar266 = ((fVar188 * 0.0 + fVar312 * 0.5) - fVar266 * 0.5) - fVar249 * 0.0;
  fVar278 = ((fVar282 * 0.0 + fVar327 * 0.5) - fVar278 * 0.5) - fVar262 * 0.0;
  fVar279 = fVar373 * 0.16666667 + fVar340 * 0.6666667 + fVar406 * 0.16666667 + fVar407 * 0.0;
  fVar281 = fVar374 * 0.16666667 + fVar355 * 0.6666667 + fVar389 * 0.16666667 + fVar411 * 0.0;
  fVar188 = fVar377 * 0.16666667 + fVar357 * 0.6666667 + fVar410 * 0.16666667 + fVar414 * 0.0;
  fVar378 = fVar397 * 0.16666667 + fVar360 * 0.6666667 + fVar425 * 0.16666667 + fVar456 * 0.0;
  fVar231 = ((fVar340 * 0.0 + fVar406 * 0.5) - fVar373 * 0.5) - fVar407 * 0.0;
  fVar247 = ((fVar355 * 0.0 + fVar389 * 0.5) - fVar374 * 0.5) - fVar411 * 0.0;
  fVar249 = ((fVar357 * 0.0 + fVar410 * 0.5) - fVar377 * 0.5) - fVar414 * 0.0;
  fVar282 = ((fVar360 * 0.0 + fVar425 * 0.5) - fVar397 * 0.5) - fVar456 * 0.0;
  fVar410 = fVar280 * fVar319 - fVar330 * fVar267;
  fVar406 = fVar283 * fVar330 - fVar334 * fVar280;
  fVar389 = fVar267 * fVar334 - fVar319 * fVar283;
  fVar425 = fVar284 * fVar338 - fVar338 * fVar284;
  fVar262 = fVar280 * fVar439 - fVar440 * fVar267;
  fVar309 = fVar283 * fVar440 - fVar300 * fVar280;
  fVar327 = fVar267 * fVar300 - fVar439 * fVar283;
  fVar303 = fVar265 * fVar279 - fVar281 * fVar396;
  fVar312 = fVar266 * fVar281 - fVar188 * fVar265;
  fVar373 = fVar396 * fVar188 - fVar279 * fVar266;
  fVar377 = fVar278 * fVar378 - fVar378 * fVar278;
  fVar279 = fVar265 * fVar231 - fVar247 * fVar396;
  fVar281 = fVar266 * fVar247 - fVar249 * fVar265;
  fVar188 = fVar396 * fVar249 - fVar231 * fVar266;
  fVar231 = fVar389 * fVar389 + fVar406 * fVar406 + fVar410 * fVar410;
  auVar144 = ZEXT416((uint)fVar231);
  auVar252 = rsqrtss(ZEXT416((uint)fVar231),auVar144);
  fVar247 = auVar252._0_4_;
  fVar374 = fVar247 * 1.5 - fVar247 * fVar247 * fVar231 * 0.5 * fVar247;
  fVar397 = fVar410 * fVar262 + fVar389 * fVar327 + fVar406 * fVar309;
  auVar144 = rcpss(auVar144,auVar144);
  fVar247 = (2.0 - fVar231 * auVar144._0_4_) * auVar144._0_4_;
  fVar249 = fVar425 * fVar374;
  fVar456 = fVar373 * fVar373 + fVar312 * fVar312 + fVar303 * fVar303;
  auVar144 = ZEXT416((uint)fVar456);
  auVar252 = rsqrtss(ZEXT416((uint)fVar456),auVar144);
  fVar340 = auVar252._0_4_;
  fVar440 = fVar340 * 1.5 - fVar340 * fVar340 * fVar456 * 0.5 * fVar340;
  fVar300 = fVar303 * fVar279 + fVar373 * fVar188 + fVar312 * fVar281;
  auVar144 = rcpss(auVar144,auVar144);
  fVar319 = (2.0 - fVar456 * auVar144._0_4_) * auVar144._0_4_;
  fVar439 = fVar377 * fVar440;
  fVar340 = fVar337 * fVar406 * fVar374;
  fVar355 = fVar337 * fVar389 * fVar374;
  fVar357 = fVar337 * fVar410 * fVar374;
  fVar360 = fVar337 * fVar249;
  fVar406 = fVar337 * fVar247 * (fVar231 * fVar309 - fVar397 * fVar406) * fVar374 +
            fVar284 * fVar406 * fVar374;
  fVar389 = fVar337 * fVar247 * (fVar231 * fVar327 - fVar397 * fVar389) * fVar374 +
            fVar284 * fVar389 * fVar374;
  fVar410 = fVar337 * fVar247 * (fVar231 * fVar262 - fVar397 * fVar410) * fVar374 +
            fVar284 * fVar410 * fVar374;
  fVar425 = fVar337 * fVar247 * (fVar231 * (fVar284 * fVar301 - fVar301 * fVar284) -
                                fVar397 * fVar425) * fVar374 + fVar284 * fVar249;
  fVar309 = fVar318 - fVar340;
  fVar327 = fVar329 - fVar355;
  fVar374 = fVar333 - fVar357;
  fVar397 = fVar337 - fVar360;
  fVar340 = fVar340 + fVar318;
  fVar355 = fVar355 + fVar329;
  fVar357 = fVar357 + fVar333;
  fVar360 = fVar360 + fVar337;
  fVar231 = fVar437 * fVar312 * fVar440;
  fVar247 = fVar437 * fVar373 * fVar440;
  fVar249 = fVar437 * fVar303 * fVar440;
  fVar262 = fVar437 * fVar439;
  fVar407 = fVar437 * fVar319 * (fVar456 * fVar281 - fVar300 * fVar312) * fVar440 +
            fVar278 * fVar312 * fVar440;
  fVar411 = fVar437 * fVar319 * (fVar456 * fVar188 - fVar300 * fVar373) * fVar440 +
            fVar278 * fVar373 * fVar440;
  fVar414 = fVar437 * fVar319 * (fVar456 * fVar279 - fVar300 * fVar303) * fVar440 +
            fVar278 * fVar303 * fVar440;
  fVar377 = fVar437 * fVar319 * (fVar456 * (fVar278 * fVar282 - fVar282 * fVar278) -
                                fVar300 * fVar377) * fVar440 + fVar278 * fVar439;
  fVar279 = fVar419 - fVar231;
  fVar281 = fVar432 - fVar247;
  fVar188 = fVar436 - fVar249;
  fVar282 = fVar437 - fVar262;
  fVar231 = fVar231 + fVar419;
  fVar247 = fVar247 + fVar432;
  fVar249 = fVar249 + fVar436;
  fVar262 = fVar262 + fVar437;
  fVar373 = 1.0 - fVar248;
  fVar439 = fVar304 * fVar373 + fVar309 * fVar248;
  fVar440 = fVar310 * fVar373 + fVar327 * fVar248;
  fVar300 = fVar313 * fVar373 + fVar374 * fVar248;
  fVar301 = fVar315 * fVar373 + fVar397 * fVar248;
  fVar304 = ((fVar250 - fVar398) * 0.33333334 + fVar304) * fVar373 +
            ((fVar267 - fVar406) * 0.33333334 + fVar309) * fVar248;
  fVar310 = ((fVar261 - fVar408) * 0.33333334 + fVar310) * fVar373 +
            ((fVar280 - fVar389) * 0.33333334 + fVar327) * fVar248;
  fVar313 = ((fVar263 - fVar412) * 0.33333334 + fVar313) * fVar373 +
            ((fVar283 - fVar410) * 0.33333334 + fVar374) * fVar248;
  fVar315 = ((fVar264 - fVar416) * 0.33333334 + fVar315) * fVar373 +
            ((fVar284 - fVar425) * 0.33333334 + fVar397) * fVar248;
  fVar419 = (fVar317 - (fVar190 - fVar415) * 0.33333334) * fVar373 +
            (fVar279 - (fVar396 - fVar407) * 0.33333334) * fVar248;
  fVar432 = (fVar328 - (fVar224 - fVar426) * 0.33333334) * fVar373 +
            (fVar281 - (fVar265 - fVar411) * 0.33333334) * fVar248;
  fVar436 = (fVar332 - (fVar227 - fVar428) * 0.33333334) * fVar373 +
            (fVar188 - (fVar266 - fVar414) * 0.33333334) * fVar248;
  fVar437 = (fVar336 - (fVar228 - fVar430) * 0.33333334) * fVar373 +
            (fVar282 - (fVar278 - fVar377) * 0.33333334) * fVar248;
  fVar303 = fVar317 * fVar373 + fVar279 * fVar248;
  fVar309 = fVar328 * fVar373 + fVar281 * fVar248;
  fVar312 = fVar332 * fVar373 + fVar188 * fVar248;
  fVar327 = fVar336 * fVar373 + fVar282 * fVar248;
  fVar328 = fVar464 * fVar373 + fVar340 * fVar248;
  fVar329 = fVar450 * fVar373 + fVar355 * fVar248;
  fVar330 = fVar454 * fVar373 + fVar357 * fVar248;
  fVar332 = fVar418 * fVar373 + fVar360 * fVar248;
  fVar250 = ((fVar398 + fVar250) * 0.33333334 + fVar464) * fVar373 +
            ((fVar406 + fVar267) * 0.33333334 + fVar340) * fVar248;
  fVar450 = ((fVar408 + fVar261) * 0.33333334 + fVar450) * fVar373 +
            ((fVar389 + fVar280) * 0.33333334 + fVar355) * fVar248;
  fVar454 = ((fVar412 + fVar263) * 0.33333334 + fVar454) * fVar373 +
            ((fVar410 + fVar283) * 0.33333334 + fVar357) * fVar248;
  fVar418 = ((fVar416 + fVar264) * 0.33333334 + fVar418) * fVar373 +
            ((fVar425 + fVar284) * 0.33333334 + fVar360) * fVar248;
  fVar279 = (fVar462 - (fVar415 + fVar190) * 0.33333334) * fVar373 +
            (fVar231 - (fVar407 + fVar396) * 0.33333334) * fVar248;
  fVar281 = (fVar438 - (fVar426 + fVar224) * 0.33333334) * fVar373 +
            (fVar247 - (fVar411 + fVar265) * 0.33333334) * fVar248;
  fVar188 = (fVar452 - (fVar428 + fVar227) * 0.33333334) * fVar373 +
            (fVar249 - (fVar414 + fVar266) * 0.33333334) * fVar248;
  fVar282 = (fVar187 - (fVar430 + fVar228) * 0.33333334) * fVar373 +
            (fVar262 - (fVar377 + fVar278) * 0.33333334) * fVar248;
  fVar190 = fVar373 * fVar462 + fVar248 * fVar231;
  fVar438 = fVar373 * fVar438 + fVar248 * fVar247;
  fVar452 = fVar373 * fVar452 + fVar248 * fVar249;
  fVar187 = fVar373 * fVar187 + fVar248 * fVar262;
  fVar231 = *(float *)(ray + k * 4);
  fVar247 = *(float *)(ray + k * 4 + 0x10);
  fVar248 = *(float *)(ray + k * 4 + 0x20);
  fVar406 = fVar439 - fVar231;
  fVar389 = fVar440 - fVar247;
  fVar410 = fVar300 - fVar248;
  fVar249 = pre->ray_space[k].vx.field_0.m128[0];
  fVar262 = pre->ray_space[k].vx.field_0.m128[1];
  fVar396 = pre->ray_space[k].vy.field_0.m128[0];
  fVar265 = pre->ray_space[k].vy.field_0.m128[1];
  fVar266 = pre->ray_space[k].vz.field_0.m128[0];
  fVar278 = pre->ray_space[k].vz.field_0.m128[1];
  fVar224 = fVar406 * fVar249 + fVar389 * fVar396 + fVar410 * fVar266;
  fVar227 = fVar406 * fVar262 + fVar389 * fVar265 + fVar410 * fVar278;
  auVar170._4_4_ = fVar227;
  auVar170._0_4_ = fVar224;
  fVar425 = fVar304 - fVar231;
  fVar373 = fVar310 - fVar247;
  fVar411 = fVar313 - fVar248;
  fVar462 = fVar425 * fVar249 + fVar373 * fVar396 + fVar411 * fVar266;
  fVar464 = fVar425 * fVar262 + fVar373 * fVar265 + fVar411 * fVar278;
  auVar401._4_4_ = fVar464;
  auVar401._0_4_ = fVar462;
  fVar340 = fVar419 - fVar231;
  fVar374 = fVar432 - fVar247;
  fVar414 = fVar436 - fVar248;
  fVar355 = fVar340 * fVar249 + fVar374 * fVar396 + fVar414 * fVar266;
  fVar377 = fVar340 * fVar262 + fVar374 * fVar265 + fVar414 * fVar278;
  auVar204._4_4_ = fVar377;
  auVar204._0_4_ = fVar355;
  fVar357 = fVar303 - fVar231;
  fVar397 = fVar309 - fVar247;
  fVar456 = fVar312 - fVar248;
  fVar360 = fVar357 * fVar249 + fVar397 * fVar396 + fVar456 * fVar266;
  fVar407 = fVar357 * fVar262 + fVar397 * fVar265 + fVar456 * fVar278;
  auVar345._4_4_ = fVar407;
  auVar345._0_4_ = fVar360;
  fVar228 = fVar328 - fVar231;
  fVar426 = fVar329 - fVar247;
  fVar283 = fVar330 - fVar248;
  fVar284 = fVar228 * fVar249 + fVar426 * fVar396 + fVar283 * fVar266;
  fVar317 = fVar228 * fVar262 + fVar426 * fVar265 + fVar283 * fVar278;
  fVar415 = fVar250 - fVar231;
  fVar280 = fVar450 - fVar247;
  fVar264 = fVar454 - fVar248;
  fVar318 = fVar415 * fVar249 + fVar280 * fVar396 + fVar264 * fVar266;
  fVar319 = fVar415 * fVar262 + fVar280 * fVar265 + fVar264 * fVar278;
  auVar401._12_4_ = fVar319;
  auVar401._8_4_ = fVar318;
  fVar267 = fVar279 - fVar231;
  fVar263 = fVar281 - fVar247;
  fVar430 = fVar188 - fVar248;
  fVar261 = fVar267 * fVar249 + fVar263 * fVar396 + fVar430 * fVar266;
  fVar428 = fVar267 * fVar262 + fVar263 * fVar265 + fVar430 * fVar278;
  fVar231 = fVar190 - fVar231;
  fVar247 = fVar438 - fVar247;
  fVar248 = fVar452 - fVar248;
  fVar396 = fVar231 * fVar249 + fVar247 * fVar396 + fVar248 * fVar266;
  fVar262 = fVar231 * fVar262 + fVar247 * fVar265 + fVar248 * fVar278;
  auVar345._12_4_ = fVar262;
  auVar345._8_4_ = fVar396;
  auVar170._8_4_ = fVar284;
  auVar170._12_4_ = fVar317;
  auVar144 = minps(auVar170,auVar401);
  auVar204._8_4_ = fVar261;
  auVar204._12_4_ = fVar428;
  auVar252 = minps(auVar204,auVar345);
  auVar144 = minps(auVar144,auVar252);
  auVar205._4_4_ = fVar227;
  auVar205._0_4_ = fVar224;
  auVar205._8_4_ = fVar284;
  auVar205._12_4_ = fVar317;
  auVar252 = maxps(auVar205,auVar401);
  auVar238._4_4_ = fVar377;
  auVar238._0_4_ = fVar355;
  auVar238._8_4_ = fVar261;
  auVar238._12_4_ = fVar428;
  auVar239 = maxps(auVar238,auVar345);
  auVar206 = maxps(auVar252,auVar239);
  auVar32._4_8_ = auVar239._8_8_;
  auVar32._0_4_ = auVar144._4_4_;
  auVar240._0_8_ = auVar32._0_8_ << 0x20;
  auVar240._8_4_ = auVar144._8_4_;
  auVar240._12_4_ = auVar144._12_4_;
  auVar241._8_8_ = auVar144._8_8_;
  auVar241._0_8_ = auVar240._8_8_;
  auVar252 = minps(auVar144,auVar241);
  auVar33._4_8_ = auVar144._8_8_;
  auVar33._0_4_ = auVar206._4_4_;
  auVar242._0_8_ = auVar33._0_8_ << 0x20;
  auVar242._8_4_ = auVar206._8_4_;
  auVar242._12_4_ = auVar206._12_4_;
  auVar243._8_8_ = auVar206._8_8_;
  auVar243._0_8_ = auVar242._8_8_;
  auVar144 = maxps(auVar206,auVar243);
  auVar171._0_8_ = auVar252._0_8_ & 0x7fffffff7fffffff;
  auVar171._8_4_ = auVar252._8_4_ & 0x7fffffff;
  auVar171._12_4_ = auVar252._12_4_ & 0x7fffffff;
  auVar207._0_8_ = auVar144._0_8_ & 0x7fffffff7fffffff;
  auVar207._8_4_ = auVar144._8_4_ & 0x7fffffff;
  auVar207._12_4_ = auVar144._12_4_ & 0x7fffffff;
  auVar144 = maxps(auVar171,auVar207);
  fVar249 = auVar144._4_4_;
  if (auVar144._4_4_ <= auVar144._0_4_) {
    fVar249 = auVar144._0_4_;
  }
  uVar111 = uVar116 + 0xf;
  fVar249 = fVar249 * 9.536743e-07;
  uVar117 = 0;
  fVar265 = *(float *)(ray + k * 4 + 0x30);
  local_538._0_4_ = 0.0;
  local_538._4_4_ = 1.0;
  fStack_530 = 0.0;
  fStack_52c = 0.0;
  local_548.lower = 0.0;
  local_548.upper = 1.0;
  local_390 = uVar111;
LAB_00391792:
  do {
    fVar266 = 1.0 - (float)local_538._0_4_;
    fVar278 = 1.0 - (float)local_538._0_4_;
    fVar333 = 1.0 - (float)local_538._4_4_;
    fVar334 = 1.0 - (float)local_538._4_4_;
    fVar381 = fVar224 * fVar266 + fVar284 * (float)local_538._0_4_;
    fVar390 = fVar227 * fVar278 + fVar317 * (float)local_538._0_4_;
    fVar392 = fVar224 * fVar333 + fVar284 * (float)local_538._4_4_;
    fVar394 = fVar227 * fVar334 + fVar317 * (float)local_538._4_4_;
    fVar398 = fVar462 * fVar266 + fVar318 * (float)local_538._0_4_;
    fVar412 = fVar464 * fVar278 + fVar319 * (float)local_538._0_4_;
    fVar375 = fVar462 * fVar333 + fVar318 * (float)local_538._4_4_;
    fVar379 = fVar464 * fVar334 + fVar319 * (float)local_538._4_4_;
    fVar457 = fVar355 * fVar266 + fVar261 * (float)local_538._0_4_;
    fVar463 = fVar377 * fVar278 + fVar428 * (float)local_538._0_4_;
    fVar465 = fVar355 * fVar333 + fVar261 * (float)local_538._4_4_;
    fVar466 = fVar377 * fVar334 + fVar428 * (float)local_538._4_4_;
    fVar399 = fVar266 * fVar360 + (float)local_538._0_4_ * fVar396;
    fVar409 = fVar278 * fVar407 + (float)local_538._0_4_ * fVar262;
    fVar413 = fVar333 * fVar360 + (float)local_538._4_4_ * fVar396;
    fVar417 = fVar334 * fVar407 + (float)local_538._4_4_ * fVar262;
    fVar433 = (local_548.upper - local_548.lower) * 0.11111111;
    fVar441 = (local_548.upper - local_548.lower) * 0.0 + local_548.lower;
    fVar451 = (local_548.upper - local_548.lower) * 0.33333334 + local_548.lower;
    fVar453 = (local_548.upper - local_548.lower) * 0.6666667 + local_548.lower;
    fVar455 = (local_548.upper - local_548.lower) * 1.0 + local_548.lower;
    fVar333 = 1.0 - fVar441;
    fVar334 = 1.0 - fVar451;
    fVar338 = 1.0 - fVar453;
    fVar378 = 1.0 - fVar455;
    fVar337 = fVar398 * fVar333 + fVar457 * fVar441;
    fVar408 = fVar398 * fVar334 + fVar457 * fVar451;
    fVar416 = fVar398 * fVar338 + fVar457 * fVar453;
    fVar302 = fVar398 * fVar378 + fVar457 * fVar455;
    fVar305 = fVar412 * fVar333 + fVar463 * fVar441;
    fVar311 = fVar412 * fVar334 + fVar463 * fVar451;
    fVar314 = fVar412 * fVar338 + fVar463 * fVar453;
    fVar316 = fVar412 * fVar378 + fVar463 * fVar455;
    fVar266 = (fVar381 * fVar333 + fVar398 * fVar441) * fVar333 + fVar441 * fVar337;
    fVar278 = (fVar381 * fVar334 + fVar398 * fVar451) * fVar334 + fVar451 * fVar408;
    fVar336 = (fVar381 * fVar338 + fVar398 * fVar453) * fVar338 + fVar453 * fVar416;
    fVar398 = (fVar381 * fVar378 + fVar398 * fVar455) * fVar378 + fVar455 * fVar302;
    fVar381 = (fVar390 * fVar333 + fVar412 * fVar441) * fVar333 + fVar441 * fVar305;
    fVar331 = (fVar390 * fVar334 + fVar412 * fVar451) * fVar334 + fVar451 * fVar311;
    fVar335 = (fVar390 * fVar338 + fVar412 * fVar453) * fVar338 + fVar453 * fVar314;
    fVar339 = (fVar390 * fVar378 + fVar412 * fVar455) * fVar378 + fVar455 * fVar316;
    fVar412 = fVar337 * fVar333 + (fVar457 * fVar333 + fVar399 * fVar441) * fVar441;
    fVar337 = fVar408 * fVar334 + (fVar457 * fVar334 + fVar399 * fVar451) * fVar451;
    fVar408 = fVar416 * fVar338 + (fVar457 * fVar338 + fVar399 * fVar453) * fVar453;
    fVar416 = fVar302 * fVar378 + (fVar457 * fVar378 + fVar399 * fVar455) * fVar455;
    fVar302 = fVar305 * fVar333 + (fVar463 * fVar333 + fVar409 * fVar441) * fVar441;
    fVar305 = fVar311 * fVar334 + (fVar463 * fVar334 + fVar409 * fVar451) * fVar451;
    fVar311 = fVar314 * fVar338 + (fVar463 * fVar338 + fVar409 * fVar453) * fVar453;
    fVar314 = fVar316 * fVar378 + (fVar463 * fVar378 + fVar409 * fVar455) * fVar455;
    fVar390 = fVar333 * fVar266 + fVar441 * fVar412;
    fVar399 = fVar334 * fVar278 + fVar451 * fVar337;
    fVar409 = fVar338 * fVar336 + fVar453 * fVar408;
    fVar457 = fVar378 * fVar398 + fVar455 * fVar416;
    fVar420 = fVar333 * fVar381 + fVar441 * fVar302;
    fVar427 = fVar334 * fVar331 + fVar451 * fVar305;
    fVar429 = fVar338 * fVar335 + fVar453 * fVar311;
    fVar431 = fVar378 * fVar339 + fVar455 * fVar314;
    fVar278 = (fVar337 - fVar278) * 3.0 * fVar433;
    fVar337 = (fVar408 - fVar336) * 3.0 * fVar433;
    fVar408 = (fVar416 - fVar398) * 3.0 * fVar433;
    fVar416 = (fVar305 - fVar331) * 3.0 * fVar433;
    fVar305 = (fVar311 - fVar335) * 3.0 * fVar433;
    fVar311 = (fVar314 - fVar339) * 3.0 * fVar433;
    fVar341 = fVar390 + (fVar412 - fVar266) * 3.0 * fVar433;
    fVar356 = fVar399 + fVar278;
    fVar358 = fVar409 + fVar337;
    fVar359 = fVar457 + fVar408;
    fVar266 = fVar420 + (fVar302 - fVar381) * 3.0 * fVar433;
    fVar336 = fVar427 + fVar416;
    fVar398 = fVar429 + fVar305;
    fVar302 = fVar431 + fVar311;
    fVar278 = fVar399 - fVar278;
    fVar337 = fVar409 - fVar337;
    fVar408 = fVar457 - fVar408;
    auVar172._0_4_ = fVar427 - fVar416;
    auVar172._4_4_ = fVar429 - fVar305;
    auVar172._8_4_ = fVar431 - fVar311;
    auVar172._12_4_ = 0;
    fVar311 = fVar375 * fVar333 + fVar465 * fVar441;
    fVar314 = fVar375 * fVar334 + fVar465 * fVar451;
    fVar316 = fVar375 * fVar338 + fVar465 * fVar453;
    fVar381 = fVar375 * fVar378 + fVar465 * fVar455;
    fVar331 = fVar379 * fVar333 + fVar466 * fVar441;
    fVar335 = fVar379 * fVar334 + fVar466 * fVar451;
    fVar339 = fVar379 * fVar338 + fVar466 * fVar453;
    fVar380 = fVar379 * fVar378 + fVar466 * fVar455;
    fVar416 = (fVar392 * fVar333 + fVar375 * fVar441) * fVar333 + fVar441 * fVar311;
    fVar412 = (fVar392 * fVar334 + fVar375 * fVar451) * fVar334 + fVar451 * fVar314;
    fVar305 = (fVar392 * fVar338 + fVar375 * fVar453) * fVar338 + fVar453 * fVar316;
    fVar392 = (fVar392 * fVar378 + fVar375 * fVar455) * fVar378 + fVar455 * fVar381;
    fVar382 = (fVar394 * fVar333 + fVar379 * fVar441) * fVar333 + fVar441 * fVar331;
    fVar391 = (fVar394 * fVar334 + fVar379 * fVar451) * fVar334 + fVar451 * fVar335;
    fVar393 = (fVar394 * fVar338 + fVar379 * fVar453) * fVar338 + fVar453 * fVar339;
    fVar395 = (fVar394 * fVar378 + fVar379 * fVar455) * fVar378 + fVar455 * fVar380;
    fVar379 = fVar311 * fVar333 + (fVar465 * fVar333 + fVar413 * fVar441) * fVar441;
    fVar394 = fVar314 * fVar334 + (fVar465 * fVar334 + fVar413 * fVar451) * fVar451;
    fVar463 = fVar316 * fVar338 + (fVar465 * fVar338 + fVar413 * fVar453) * fVar453;
    fVar413 = fVar381 * fVar378 + (fVar465 * fVar378 + fVar413 * fVar455) * fVar455;
    fVar361 = fVar331 * fVar333 + (fVar466 * fVar333 + fVar417 * fVar441) * fVar441;
    fVar465 = fVar335 * fVar334 + (fVar466 * fVar334 + fVar417 * fVar451) * fVar451;
    fVar376 = fVar339 * fVar338 + (fVar466 * fVar338 + fVar417 * fVar453) * fVar453;
    fVar380 = fVar380 * fVar378 + (fVar466 * fVar378 + fVar417 * fVar455) * fVar455;
    fVar331 = fVar333 * fVar416 + fVar441 * fVar379;
    fVar335 = fVar334 * fVar412 + fVar451 * fVar394;
    fVar339 = fVar338 * fVar305 + fVar453 * fVar463;
    fVar375 = fVar378 * fVar392 + fVar455 * fVar413;
    fVar311 = fVar333 * fVar382 + fVar441 * fVar361;
    fVar314 = fVar334 * fVar391 + fVar451 * fVar465;
    fVar316 = fVar338 * fVar393 + fVar453 * fVar376;
    fVar381 = fVar378 * fVar395 + fVar455 * fVar380;
    fVar333 = (fVar394 - fVar412) * 3.0 * fVar433;
    fVar338 = (fVar463 - fVar305) * 3.0 * fVar433;
    fVar412 = (fVar413 - fVar392) * 3.0 * fVar433;
    fVar413 = (fVar465 - fVar391) * 3.0 * fVar433;
    fVar465 = (fVar376 - fVar393) * 3.0 * fVar433;
    fVar376 = (fVar380 - fVar395) * 3.0 * fVar433;
    fVar393 = fVar331 + (fVar379 - fVar416) * 3.0 * fVar433;
    fVar395 = fVar335 + fVar333;
    fVar417 = fVar339 + fVar338;
    fVar441 = fVar375 + fVar412;
    fVar361 = fVar311 + (fVar361 - fVar382) * 3.0 * fVar433;
    fVar380 = fVar314 + fVar413;
    fVar382 = fVar316 + fVar465;
    fVar391 = fVar381 + fVar376;
    fVar333 = fVar335 - fVar333;
    fVar338 = fVar339 - fVar338;
    fVar412 = fVar375 - fVar412;
    fVar413 = fVar314 - fVar413;
    fVar465 = fVar316 - fVar465;
    fVar376 = fVar381 - fVar376;
    fVar334 = (fVar335 - fVar399) + (fVar331 - fVar390);
    fVar378 = (fVar339 - fVar409) + (fVar335 - fVar399);
    fVar416 = (fVar375 - fVar457) + (fVar339 - fVar409);
    fVar305 = (fVar375 - fVar457) + 0.0;
    fVar392 = (fVar314 - fVar427) + (fVar311 - fVar420);
    fVar379 = (fVar316 - fVar429) + (fVar314 - fVar427);
    fVar394 = (fVar381 - fVar431) + (fVar316 - fVar429);
    fVar463 = (fVar381 - fVar431) + 0.0;
    auVar320._0_8_ =
         CONCAT44(fVar427 * fVar378 - fVar399 * fVar379,fVar420 * fVar334 - fVar390 * fVar392);
    auVar320._8_4_ = fVar429 * fVar416 - fVar409 * fVar394;
    auVar320._12_4_ = fVar431 * fVar305 - fVar457 * fVar463;
    auVar268._0_4_ = fVar266 * fVar334 - fVar341 * fVar392;
    auVar268._4_4_ = fVar336 * fVar378 - fVar356 * fVar379;
    auVar268._8_4_ = fVar398 * fVar416 - fVar358 * fVar394;
    auVar268._12_4_ = fVar302 * fVar305 - fVar359 * fVar463;
    auVar290._0_8_ =
         CONCAT44(auVar172._4_4_ * fVar378 - fVar379 * fVar337,
                  auVar172._0_4_ * fVar334 - fVar392 * fVar278);
    auVar290._8_4_ = auVar172._8_4_ * fVar416 - fVar394 * fVar408;
    auVar290._12_4_ = fVar305 * 0.0 - fVar463 * 0.0;
    auVar422._0_4_ = fVar334 * fVar427 - fVar392 * fVar399;
    auVar422._4_4_ = fVar378 * fVar429 - fVar379 * fVar409;
    auVar422._8_4_ = fVar416 * fVar431 - fVar394 * fVar457;
    auVar422._12_4_ = fVar305 * 0.0 - fVar463 * 0.0;
    auVar366._0_8_ =
         CONCAT44(fVar314 * fVar378 - fVar335 * fVar379,fVar311 * fVar334 - fVar331 * fVar392);
    auVar366._8_4_ = fVar316 * fVar416 - fVar339 * fVar394;
    auVar366._12_4_ = fVar381 * fVar305 - fVar375 * fVar463;
    auVar434._0_4_ = fVar361 * fVar334 - fVar393 * fVar392;
    auVar434._4_4_ = fVar380 * fVar378 - fVar395 * fVar379;
    auVar434._8_4_ = fVar382 * fVar416 - fVar417 * fVar394;
    auVar434._12_4_ = fVar391 * fVar305 - fVar441 * fVar463;
    auVar346._0_8_ =
         CONCAT44(fVar465 * fVar378 - fVar379 * fVar338,fVar413 * fVar334 - fVar392 * fVar333);
    auVar346._8_4_ = fVar376 * fVar416 - fVar394 * fVar412;
    auVar346._12_4_ = fVar305 * 0.0 - fVar463 * 0.0;
    auVar181._0_4_ = fVar334 * fVar314 - fVar392 * fVar335;
    auVar181._4_4_ = fVar378 * fVar316 - fVar379 * fVar339;
    auVar181._8_4_ = fVar416 * fVar381 - fVar394 * fVar375;
    auVar181._12_4_ = fVar305 * 0.0 - fVar463 * 0.0;
    auVar208._8_4_ = auVar320._8_4_;
    auVar208._0_8_ = auVar320._0_8_;
    auVar208._12_4_ = auVar320._12_4_;
    auVar144 = minps(auVar208,auVar268);
    auVar206 = maxps(auVar320,auVar268);
    auVar269._8_4_ = auVar290._8_4_;
    auVar269._0_8_ = auVar290._0_8_;
    auVar269._12_4_ = auVar290._12_4_;
    auVar252 = minps(auVar269,auVar422);
    auVar144 = minps(auVar144,auVar252);
    auVar252 = maxps(auVar290,auVar422);
    auVar239 = maxps(auVar206,auVar252);
    auVar270._8_4_ = auVar366._8_4_;
    auVar270._0_8_ = auVar366._0_8_;
    auVar270._12_4_ = auVar366._12_4_;
    auVar252 = minps(auVar270,auVar434);
    auVar367 = maxps(auVar366,auVar434);
    auVar291._8_4_ = auVar346._8_4_;
    auVar291._0_8_ = auVar346._0_8_;
    auVar291._12_4_ = auVar346._12_4_;
    auVar206 = minps(auVar291,auVar181);
    auVar252 = minps(auVar252,auVar206);
    auVar144 = minps(auVar144,auVar252);
    auVar252 = maxps(auVar346,auVar181);
    auVar252 = maxps(auVar367,auVar252);
    auVar252 = maxps(auVar239,auVar252);
    bVar118 = auVar144._4_4_ <= fVar249;
    bVar27 = auVar144._8_4_ <= fVar249;
    auVar97._4_4_ = -(uint)bVar27;
    auVar97._0_4_ = -(uint)bVar118;
    auVar97._8_4_ = -(uint)(auVar144._12_4_ <= fVar249);
    auVar97._12_4_ = 0;
    auVar212 = auVar97 << 0x20;
    bVar101 = (-fVar249 <= auVar252._0_4_ && auVar144._0_4_ <= fVar249) && bVar29;
    auVar321._0_4_ = -(uint)bVar101;
    bVar102 = (-fVar249 <= auVar252._4_4_ && bVar118) && bVar30;
    auVar321._4_4_ = -(uint)bVar102;
    bVar118 = (-fVar249 <= auVar252._8_4_ && bVar27) && bVar31;
    auVar321._8_4_ = -(uint)bVar118;
    auVar321._12_4_ = 0;
    uVar121 = movmskps((int)uVar111,auVar321);
    uVar111 = (ulong)uVar121;
    if (uVar121 != 0) {
      fVar334 = (fVar335 - fVar331) + (fVar399 - fVar390);
      fVar378 = (fVar339 - fVar335) + (fVar409 - fVar399);
      fVar416 = (fVar375 - fVar339) + (fVar457 - fVar409);
      fVar305 = (0.0 - fVar375) + (0.0 - fVar457);
      fVar392 = (fVar314 - fVar311) + (fVar427 - fVar420);
      fVar379 = (fVar316 - fVar314) + (fVar429 - fVar427);
      fVar394 = (fVar381 - fVar316) + (fVar431 - fVar429);
      fVar463 = (0.0 - fVar381) + (0.0 - fVar431);
      auVar447._0_8_ =
           CONCAT44(fVar427 * fVar378 - fVar399 * fVar379,fVar420 * fVar334 - fVar390 * fVar392);
      auVar447._8_4_ = fVar429 * fVar416 - fVar409 * fVar394;
      auVar447._12_4_ = fVar431 * fVar305 - fVar457 * fVar463;
      auVar271._0_4_ = fVar266 * fVar334 - fVar341 * fVar392;
      auVar271._4_4_ = fVar336 * fVar378 - fVar356 * fVar379;
      auVar271._8_4_ = fVar398 * fVar416 - fVar358 * fVar394;
      auVar271._12_4_ = fVar302 * fVar305 - fVar359 * fVar463;
      auVar347._0_8_ =
           CONCAT44(auVar172._4_4_ * fVar378 - fVar337 * fVar379,
                    auVar172._0_4_ * fVar334 - fVar278 * fVar392);
      auVar347._8_4_ = auVar172._8_4_ * fVar416 - fVar408 * fVar394;
      auVar347._12_4_ = fVar305 * 0.0 - fVar463 * 0.0;
      auVar292._0_4_ = fVar427 * fVar334 - fVar399 * fVar392;
      auVar292._4_4_ = fVar429 * fVar378 - fVar409 * fVar379;
      auVar292._8_4_ = fVar431 * fVar416 - fVar457 * fVar394;
      auVar292._12_4_ = fVar305 * 0.0 - fVar463 * 0.0;
      auVar244._0_8_ =
           CONCAT44(fVar314 * fVar378 - fVar335 * fVar379,fVar311 * fVar334 - fVar331 * fVar392);
      auVar244._8_4_ = fVar316 * fVar416 - fVar339 * fVar394;
      auVar244._12_4_ = fVar381 * fVar305 - fVar375 * fVar463;
      auVar384._0_4_ = fVar361 * fVar334 - fVar393 * fVar392;
      auVar384._4_4_ = fVar380 * fVar378 - fVar395 * fVar379;
      auVar384._8_4_ = fVar382 * fVar416 - fVar417 * fVar394;
      auVar384._12_4_ = fVar391 * fVar305 - fVar441 * fVar463;
      auVar423._0_8_ =
           CONCAT44(fVar465 * fVar378 - fVar338 * fVar379,fVar413 * fVar334 - fVar333 * fVar392);
      auVar423._8_4_ = fVar376 * fVar416 - fVar412 * fVar394;
      auVar423._12_4_ = fVar305 * 0.0 - fVar463 * 0.0;
      auVar181._0_4_ = fVar334 * fVar314 - fVar392 * fVar335;
      auVar181._4_4_ = fVar378 * fVar316 - fVar379 * fVar339;
      auVar181._8_4_ = fVar416 * fVar381 - fVar394 * fVar375;
      auVar181._12_4_ = fVar305 * 0.0 - fVar463 * 0.0;
      auVar209._8_4_ = auVar447._8_4_;
      auVar209._0_8_ = auVar447._0_8_;
      auVar209._12_4_ = auVar447._12_4_;
      auVar144 = minps(auVar209,auVar271);
      auVar206 = maxps(auVar447,auVar271);
      auVar272._8_4_ = auVar347._8_4_;
      auVar272._0_8_ = auVar347._0_8_;
      auVar272._12_4_ = auVar347._12_4_;
      auVar252 = minps(auVar272,auVar292);
      auVar144 = minps(auVar144,auVar252);
      auVar252 = maxps(auVar347,auVar292);
      auVar367 = maxps(auVar206,auVar252);
      auVar273._8_4_ = auVar244._8_4_;
      auVar273._0_8_ = auVar244._0_8_;
      auVar273._12_4_ = auVar244._12_4_;
      auVar206 = minps(auVar273,auVar384);
      auVar252 = maxps(auVar244,auVar384);
      auVar293._8_4_ = auVar423._8_4_;
      auVar293._0_8_ = auVar423._0_8_;
      auVar293._12_4_ = auVar423._12_4_;
      auVar239 = minps(auVar293,auVar181);
      auVar206 = minps(auVar206,auVar239);
      auVar144 = minps(auVar144,auVar206);
      auVar206 = maxps(auVar423,auVar181);
      auVar252 = maxps(auVar252,auVar206);
      auVar252 = maxps(auVar367,auVar252);
      bVar27 = auVar144._4_4_ <= fVar249;
      bVar28 = auVar144._8_4_ <= fVar249;
      auVar98._4_4_ = -(uint)bVar28;
      auVar98._0_4_ = -(uint)bVar27;
      auVar98._8_4_ = -(uint)(auVar144._12_4_ <= fVar249);
      auVar98._12_4_ = 0;
      auVar212 = auVar98 << 0x20;
      auVar448._0_4_ = -(uint)((-fVar249 <= auVar252._0_4_ && auVar144._0_4_ <= fVar249) && bVar101)
      ;
      auVar448._4_4_ = -(uint)((-fVar249 <= auVar252._4_4_ && bVar27) && bVar102);
      auVar448._8_4_ = -(uint)((-fVar249 <= auVar252._8_4_ && bVar28) && bVar118);
      auVar448._12_4_ = 0;
      uVar121 = movmskps(uVar121,auVar448);
      uVar111 = (ulong)uVar121;
      if (uVar121 != 0) {
        uVar111 = (ulong)(byte)uVar121;
        mask_stack[uVar117] = uVar121 & 0xff;
        cu_stack[uVar117] = local_548;
        cv_stack[uVar117].lower = (float)local_538._0_4_;
        cv_stack[uVar117].upper = (float)local_538._4_4_;
        uVar117 = (ulong)((int)uVar117 + 1);
        auVar181 = _local_538;
      }
    }
LAB_00391e00:
    _local_518 = auVar172;
    auVar144 = _local_518;
    if ((int)uVar117 == 0) {
      fVar231 = *(float *)(ray + k * 4 + 0x80);
      auVar221._4_4_ = -(uint)(fVar223 <= fVar231);
      auVar221._0_4_ = -(uint)(fVar189 <= fVar231);
      auVar221._8_4_ = -(uint)(fVar226 <= fVar231);
      auVar221._12_4_ = -(uint)(fVar230 <= fVar231);
      uVar119 = movmskps((int)uVar111,auVar221);
      uVar119 = (uint)uVar116 & (uint)local_390 & uVar119;
      goto LAB_0039090b;
    }
    uVar122 = (int)uVar117 - 1;
    uVar111 = (ulong)uVar122;
    uVar121 = mask_stack[uVar111];
    local_538._0_4_ = cv_stack[uVar111].lower;
    local_538._4_4_ = cv_stack[uVar111].upper;
    fStack_530 = 0.0;
    fStack_52c = 0.0;
    uVar10 = 0;
    if (uVar121 != 0) {
      for (; (uVar121 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    uVar121 = uVar121 - 1 & uVar121;
    mask_stack[uVar111] = uVar121;
    if (uVar121 == 0) {
      uVar117 = (ulong)uVar122;
    }
    fVar333 = (float)(uVar10 + 1) * 0.33333334;
    fVar334 = auVar181._4_4_ * 0.0;
    fVar336 = auVar212._4_4_ * 0.0;
    fVar266 = cu_stack[uVar111].lower;
    fVar278 = cu_stack[uVar111].upper;
    local_548.lower =
         fVar266 * (1.0 - (float)uVar10 * 0.33333334) + fVar278 * (float)uVar10 * 0.33333334;
    local_548.upper = fVar266 * (1.0 - fVar333) + fVar278 * fVar333;
    fVar333 = fVar266 * (0.0 - fVar334) + fVar278 * fVar334;
    fVar278 = fVar266 * (0.0 - fVar336) + fVar278 * fVar336;
    fVar266 = local_548.upper - local_548.lower;
    if (fVar266 < 0.16666667) {
      fVar398 = 1.0 - (float)local_538._0_4_;
      fVar412 = 1.0 - (float)local_538._0_4_;
      fVar305 = 1.0 - (float)local_538._4_4_;
      fVar311 = 1.0 - (float)local_538._4_4_;
      fVar378 = fVar224 * fVar398 + fVar284 * (float)local_538._0_4_;
      fVar408 = fVar227 * fVar412 + fVar317 * (float)local_538._0_4_;
      fVar416 = fVar224 * fVar305 + fVar284 * (float)local_538._4_4_;
      fVar302 = fVar227 * fVar311 + fVar317 * (float)local_538._4_4_;
      fVar334 = fVar462 * fVar398 + fVar318 * (float)local_538._0_4_;
      fVar336 = fVar464 * fVar412 + fVar319 * (float)local_538._0_4_;
      fVar337 = fVar462 * fVar305 + fVar318 * (float)local_538._4_4_;
      fVar338 = fVar464 * fVar311 + fVar319 * (float)local_538._4_4_;
      fVar339 = fVar355 * fVar398 + fVar261 * (float)local_538._0_4_;
      fVar375 = fVar377 * fVar412 + fVar428 * (float)local_538._0_4_;
      fVar379 = fVar355 * fVar305 + fVar261 * (float)local_538._4_4_;
      fVar463 = fVar377 * fVar311 + fVar428 * (float)local_538._4_4_;
      fVar331 = (fVar398 * fVar360 + (float)local_538._0_4_ * fVar396) - fVar339;
      fVar399 = (fVar412 * fVar407 + (float)local_538._0_4_ * fVar262) - fVar375;
      fVar335 = (fVar305 * fVar360 + (float)local_538._4_4_ * fVar396) - fVar379;
      fVar409 = (fVar311 * fVar407 + (float)local_538._4_4_ * fVar262) - fVar463;
      fVar398 = local_548.lower * (fVar339 - fVar334) + fVar334;
      fVar412 = local_548.lower * (fVar375 - fVar336) + fVar336;
      fVar305 = local_548.lower * (fVar379 - fVar337) + fVar337;
      fVar311 = local_548.lower * (fVar463 - fVar338) + fVar338;
      fVar457 = (fVar339 - fVar334) * local_548.upper + fVar334;
      fVar392 = (fVar375 - fVar336) * local_548.upper + fVar336;
      fVar394 = (fVar379 - fVar337) * local_548.upper + fVar337;
      fVar413 = (fVar463 - fVar338) * local_548.upper + fVar338;
      fVar314 = local_548.lower * (fVar334 - fVar378) + fVar378;
      fVar316 = local_548.lower * (fVar336 - fVar408) + fVar408;
      fVar381 = local_548.lower * (fVar337 - fVar416) + fVar416;
      fVar390 = local_548.lower * (fVar338 - fVar302) + fVar302;
      fVar314 = (fVar398 - fVar314) * local_548.lower + fVar314;
      fVar316 = (fVar412 - fVar316) * local_548.lower + fVar316;
      fVar381 = (fVar305 - fVar381) * local_548.lower + fVar381;
      fVar390 = (fVar311 - fVar390) * local_548.lower + fVar390;
      fVar398 = (((local_548.lower * fVar331 + fVar339) - fVar398) * local_548.lower + fVar398) -
                fVar314;
      fVar412 = (((local_548.lower * fVar399 + fVar375) - fVar412) * local_548.lower + fVar412) -
                fVar316;
      fVar305 = (((local_548.lower * fVar335 + fVar379) - fVar305) * local_548.lower + fVar305) -
                fVar381;
      fVar311 = (((local_548.lower * fVar409 + fVar463) - fVar311) * local_548.lower + fVar311) -
                fVar390;
      fVar314 = local_548.lower * fVar398 + fVar314;
      fVar316 = local_548.lower * fVar412 + fVar316;
      fVar381 = local_548.lower * fVar305 + fVar381;
      fVar390 = local_548.lower * fVar311 + fVar390;
      fVar378 = (fVar334 - fVar378) * local_548.upper + fVar378;
      fVar408 = (fVar336 - fVar408) * local_548.upper + fVar408;
      fVar416 = (fVar337 - fVar416) * local_548.upper + fVar416;
      fVar302 = (fVar338 - fVar302) * local_548.upper + fVar302;
      fVar378 = (fVar457 - fVar378) * local_548.upper + fVar378;
      fVar408 = (fVar392 - fVar408) * local_548.upper + fVar408;
      fVar416 = (fVar394 - fVar416) * local_548.upper + fVar416;
      fVar302 = (fVar413 - fVar302) * local_548.upper + fVar302;
      fVar336 = (((fVar331 * local_548.upper + fVar339) - fVar457) * local_548.upper + fVar457) -
                fVar378;
      fVar337 = (((fVar399 * local_548.upper + fVar375) - fVar392) * local_548.upper + fVar392) -
                fVar408;
      fVar338 = (((fVar335 * local_548.upper + fVar379) - fVar394) * local_548.upper + fVar394) -
                fVar416;
      fVar392 = (((fVar409 * local_548.upper + fVar463) - fVar413) * local_548.upper + fVar413) -
                fVar302;
      fVar378 = local_548.upper * fVar336 + fVar378;
      fVar408 = local_548.upper * fVar337 + fVar408;
      fVar416 = local_548.upper * fVar338 + fVar416;
      fVar302 = local_548.upper * fVar392 + fVar302;
      fVar334 = fVar266 * 0.33333334;
      fVar331 = fVar398 * (float)DAT_01f4afa0 * fVar334 + fVar314;
      fVar399 = fVar412 * DAT_01f4afa0._4_4_ * fVar334 + fVar316;
      fVar335 = fVar305 * DAT_01f4afa0._8_4_ * fVar334 + fVar381;
      fVar409 = fVar311 * DAT_01f4afa0._12_4_ * fVar334 + fVar390;
      fVar339 = fVar378 - fVar334 * fVar336 * (float)DAT_01f4afa0;
      fVar457 = fVar408 - fVar334 * fVar337 * DAT_01f4afa0._4_4_;
      fVar375 = fVar416 - fVar334 * fVar338 * DAT_01f4afa0._8_4_;
      fVar392 = fVar302 - fVar334 * fVar392 * DAT_01f4afa0._12_4_;
      auVar34._4_8_ = DAT_01f4afa0._8_8_;
      auVar34._0_4_ = fVar408;
      auVar348._0_8_ = auVar34._0_8_ << 0x20;
      auVar348._8_4_ = fVar416;
      auVar348._12_4_ = fVar302;
      fVar398 = (fVar416 - fVar378) + (fVar381 - fVar314);
      fVar412 = (fVar302 - fVar408) + (fVar390 - fVar316);
      auVar368._0_4_ = fVar457 * fVar412;
      auVar368._4_4_ = fVar457 * fVar412;
      auVar368._8_4_ = fVar392 * fVar412;
      auVar368._12_4_ = fVar392 * fVar412;
      fVar334 = fVar314 * fVar398 + fVar316 * fVar412;
      fVar336 = fVar381 * fVar398 + fVar390 * fVar412;
      fVar305 = fVar331 * fVar398 + fVar399 * fVar412;
      fVar311 = fVar335 * fVar398 + fVar409 * fVar412;
      fVar379 = fVar339 * fVar398 + auVar368._0_4_;
      auVar322._0_8_ = CONCAT44(fVar457 * fVar398 + auVar368._4_4_,fVar379);
      auVar322._8_4_ = fVar375 * fVar398 + auVar368._8_4_;
      auVar322._12_4_ = fVar392 * fVar398 + auVar368._12_4_;
      fVar338 = fVar398 * fVar378 + fVar412 * fVar408;
      fVar394 = fVar398 * fVar416 + fVar412 * fVar302;
      auVar35._4_8_ = auVar368._8_8_;
      auVar35._0_4_ = fVar399 * fVar398 + fVar399 * fVar412;
      auVar369._0_8_ = auVar35._0_8_ << 0x20;
      auVar369._8_4_ = fVar311;
      auVar369._12_4_ = fVar409 * fVar398 + fVar409 * fVar412;
      fVar337 = fVar305;
      if (fVar305 <= fVar334) {
        fVar337 = fVar334;
        fVar334 = fVar305;
      }
      auVar370._8_8_ = auVar369._8_8_;
      auVar370._0_8_ = auVar370._8_8_;
      auVar173._8_4_ = auVar322._8_4_;
      auVar173._0_8_ = auVar322._0_8_;
      auVar173._12_4_ = auVar322._12_4_;
      if (fVar338 <= fVar379) {
        auVar173._0_4_ = fVar338;
      }
      if (auVar173._0_4_ <= fVar334) {
        fVar334 = auVar173._0_4_;
      }
      auVar36._4_8_ = auVar173._8_8_;
      auVar36._0_4_ = fVar398 * fVar408 + fVar412 * fVar408;
      auVar174._0_8_ = auVar36._0_8_ << 0x20;
      auVar174._8_4_ = fVar394;
      auVar174._12_4_ = fVar398 * fVar302 + fVar412 * fVar302;
      if (fVar338 <= fVar379) {
        fVar338 = fVar379;
      }
      auVar181._8_8_ = auVar174._8_8_;
      auVar181._0_8_ = auVar181._8_8_;
      if (fVar338 <= fVar337) {
        fVar338 = fVar337;
      }
      if (fVar311 <= fVar336) {
        auVar370._0_4_ = fVar336;
        fVar336 = fVar311;
      }
      auVar210._8_4_ = auVar322._8_4_;
      auVar210._0_8_ = auVar322._8_8_;
      auVar210._12_4_ = auVar322._12_4_;
      if (fVar394 <= auVar322._8_4_) {
        auVar210._0_4_ = fVar394;
      }
      if (auVar210._0_4_ <= fVar336) {
        fVar336 = auVar210._0_4_;
      }
      if (fVar394 <= auVar322._8_4_) {
        auVar181._0_4_ = auVar322._8_4_;
      }
      if (auVar181._0_4_ <= auVar370._0_4_) {
        auVar181._0_4_ = auVar370._0_4_;
      }
      bVar118 = 3 < (uint)uVar117;
      uVar37 = (undefined3)(uVar122 >> 8);
      uVar111 = (ulong)CONCAT31(uVar37,bVar118);
      fVar337 = auVar181._0_4_;
      if ((0.0001 <= fVar334) || (fVar337 <= -0.0001)) break;
      goto LAB_0039215f;
    }
  } while( true );
  auVar212._0_12_ = ZEXT812(0x38d1b717);
  auVar212._12_4_ = 0;
  if ((fVar336 < 0.0001 && -0.0001 < fVar338) ||
     ((fVar334 < 0.0001 && -0.0001 < fVar338 ||
      (auVar172 = _local_518, fVar336 < 0.0001 && -0.0001 < fVar337)))) {
LAB_0039215f:
    local_518 = (undefined1  [8])auVar348._8_8_;
    auVar172 = _local_518;
    local_508 = CONCAT44(fVar302,fVar416);
    bVar118 = bVar118 || fVar266 < 0.001;
    uVar111 = (ulong)CONCAT31(uVar37,bVar118);
    fVar412 = (float)(~-(uint)(fVar334 < 0.0) & 0x3f800000 | -(uint)(fVar334 < 0.0) & 0xbf800000);
    fVar305 = (float)(~-(uint)(fVar338 < 0.0) & 0x3f800000 | -(uint)(fVar338 < 0.0) & 0xbf800000);
    fVar398 = 0.0;
    if ((fVar412 == fVar305) && (!NAN(fVar412) && !NAN(fVar305))) {
      fVar398 = INFINITY;
    }
    fVar311 = 0.0;
    if ((fVar412 == fVar305) && (!NAN(fVar412) && !NAN(fVar305))) {
      fVar311 = -INFINITY;
    }
    fVar379 = (float)(~-(uint)(fVar336 < 0.0) & 0x3f800000 | -(uint)(fVar336 < 0.0) & 0xbf800000);
    if ((fVar412 != fVar379) || (fVar394 = fVar311, NAN(fVar412) || NAN(fVar379))) {
      if ((fVar336 != fVar334) || (NAN(fVar336) || NAN(fVar334))) {
        fVar336 = -fVar334 / (fVar336 - fVar334);
        fVar336 = (1.0 - fVar336) * 0.0 + fVar336;
        fVar394 = fVar336;
      }
      else {
        fVar336 = 0.0;
        if ((fVar334 != 0.0) || (fVar394 = 1.0, NAN(fVar334))) {
          fVar336 = INFINITY;
          fVar394 = -INFINITY;
        }
      }
      if (fVar336 <= fVar398) {
        fVar398 = fVar336;
      }
      if (fVar394 <= fVar311) {
        fVar394 = fVar311;
      }
    }
    fVar334 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar337 < 0.0) * 4);
    if ((fVar305 != fVar334) || (fVar336 = fVar394, NAN(fVar305) || NAN(fVar334))) {
      if ((fVar337 != fVar338) || (NAN(fVar337) || NAN(fVar338))) {
        fVar412 = -fVar338 / (fVar337 - fVar338);
        fVar412 = (1.0 - fVar412) * 0.0 + fVar412;
        fVar336 = fVar412;
      }
      else {
        fVar412 = 0.0;
        if ((fVar338 != 0.0) || (fVar336 = 1.0, NAN(fVar338))) {
          fVar412 = INFINITY;
          fVar336 = -INFINITY;
        }
      }
      if (fVar412 <= fVar398) {
        fVar398 = fVar412;
      }
      if (fVar336 <= fVar394) {
        fVar336 = fVar394;
      }
    }
    if ((fVar379 != fVar334) || (NAN(fVar379) || NAN(fVar334))) {
      fVar398 = (float)(~-(uint)(fVar398 < 1.0) & 0x3f800000 |
                       (uint)fVar398 & -(uint)(fVar398 < 1.0));
      fVar336 = (float)(~-(uint)(fVar336 < 1.0) & (uint)fVar336 |
                       -(uint)(fVar336 < 1.0) & 0x3f800000);
    }
    fStack_510 = auVar144._8_4_;
    fStack_50c = auVar144._12_4_;
    auVar211._0_8_ =
         CONCAT44(~-(uint)(fVar336 < 1.0),~-(uint)(fVar398 < 0.0) & (uint)fVar398) &
         0x3f800000ffffffff;
    auVar211._8_8_ = 0;
    auVar212 = auVar211 | ZEXT416((uint)fVar336 & -(uint)(fVar336 < 1.0)) << 0x20;
    fVar334 = auVar212._4_4_;
    auVar181._4_4_ = fVar334;
    auVar181._0_4_ = fVar334;
    auVar181._8_4_ = fVar334;
    auVar181._12_4_ = fVar334;
    if (auVar212._0_4_ <= fVar334) {
      fVar336 = auVar212._0_4_ + -0.1;
      fVar338 = auVar212._8_4_ + 0.0;
      fVar398 = auVar212._12_4_ + 0.0;
      uVar121 = -(uint)(fVar334 + 0.1 < 1.0);
      fVar336 = (float)(~-(uint)(fVar336 < 0.0) & (uint)fVar336);
      fVar334 = (float)(~uVar121 & 0x3f800000 | (uint)(fVar334 + 0.1) & uVar121);
      fVar379 = 1.0 - fVar336;
      fVar394 = 1.0 - fVar336;
      fVar463 = 1.0 - fVar334;
      fVar413 = 1.0 - fVar334;
      fVar412 = fVar314 * fVar379 + fVar381 * fVar336;
      fVar305 = fVar316 * fVar394 + fVar390 * fVar336;
      fVar311 = fVar314 * fVar463 + fVar381 * fVar334;
      fVar314 = fVar316 * fVar413 + fVar390 * fVar334;
      fVar316 = fVar331 * fVar379 + fVar335 * fVar336;
      fVar381 = fVar399 * fVar394 + fVar409 * fVar336;
      fVar390 = fVar331 * fVar463 + fVar335 * fVar334;
      fVar331 = fVar399 * fVar413 + fVar409 * fVar334;
      fVar399 = fVar339 * fVar379 + fVar375 * fVar336;
      fVar335 = fVar457 * fVar394 + fVar392 * fVar336;
      fVar409 = fVar339 * fVar463 + fVar375 * fVar334;
      fVar339 = fVar457 * fVar413 + fVar392 * fVar334;
      fVar416 = fVar379 * fVar378 + fVar416 * fVar336;
      fVar302 = fVar394 * fVar408 + fVar302 * fVar336;
      fVar457 = fVar463 * fVar378 + fStack_510 * fVar334;
      fVar375 = fVar413 * fVar408 + fStack_50c * fVar334;
      fVar378 = (float)local_538._4_4_ * fVar338;
      fVar408 = (float)local_538._4_4_ * fVar398;
      fVar392 = (float)local_538._0_4_ * (1.0 - fVar334);
      fStack_530 = (float)local_538._0_4_ * (0.0 - fVar338);
      fStack_52c = (float)local_538._0_4_ * (0.0 - fVar398);
      local_538._0_4_ = (float)local_538._0_4_ * (1.0 - fVar336) + (float)local_538._4_4_ * fVar336;
      local_538._4_4_ = fVar392 + (float)local_538._4_4_ * fVar334;
      fStack_530 = fStack_530 + fVar378;
      fStack_52c = fStack_52c + fVar408;
      fVar266 = 1.0 / fVar266;
      auVar213._0_4_ = fVar457 - fVar416;
      auVar213._4_4_ = fVar375 - fVar302;
      auVar213._8_4_ = fVar457 - fVar457;
      auVar213._12_4_ = fVar375 - fVar375;
      auVar258._0_8_ = CONCAT44(fVar339 - fVar335,fVar409 - fVar399);
      auVar258._8_4_ = fVar409 - fVar409;
      auVar258._12_4_ = fVar339 - fVar339;
      auVar294._0_4_ = fVar390 - fVar316;
      auVar294._4_4_ = fVar331 - fVar381;
      auVar294._8_4_ = fVar390 - fVar390;
      auVar294._12_4_ = fVar331 - fVar331;
      auVar371._0_8_ = CONCAT44((fVar381 - fVar305) * 3.0,(fVar316 - fVar412) * 3.0);
      auVar371._8_4_ = (fVar390 - fVar311) * 3.0;
      auVar371._12_4_ = (fVar331 - fVar314) * 3.0;
      auVar274._0_8_ = CONCAT44((fVar335 - fVar381) * 3.0,(fVar399 - fVar316) * 3.0);
      auVar274._8_4_ = (fVar409 - fVar390) * 3.0;
      auVar274._12_4_ = (fVar339 - fVar331) * 3.0;
      auVar402._0_4_ = (fVar416 - fVar399) * 3.0;
      auVar402._4_4_ = (fVar302 - fVar335) * 3.0;
      auVar402._8_4_ = (fVar457 - fVar409) * 3.0;
      auVar402._12_4_ = (fVar375 - fVar339) * 3.0;
      auVar323._8_4_ = auVar274._8_4_;
      auVar323._0_8_ = auVar274._0_8_;
      auVar323._12_4_ = auVar274._12_4_;
      auVar252 = minps(auVar323,auVar402);
      auVar144 = maxps(auVar274,auVar402);
      auVar385._8_4_ = auVar371._8_4_;
      auVar385._0_8_ = auVar371._0_8_;
      auVar385._12_4_ = auVar371._12_4_;
      auVar239 = minps(auVar385,auVar252);
      auVar206 = maxps(auVar371,auVar144);
      auVar38._4_8_ = auVar144._8_8_;
      auVar38._0_4_ = auVar239._4_4_;
      auVar275._0_8_ = auVar38._0_8_ << 0x20;
      auVar275._8_4_ = auVar239._8_4_;
      auVar275._12_4_ = auVar239._12_4_;
      auVar276._8_8_ = auVar239._8_8_;
      auVar276._0_8_ = auVar275._8_8_;
      auVar39._4_8_ = auVar252._8_8_;
      auVar39._0_4_ = auVar206._4_4_;
      auVar324._0_8_ = auVar39._0_8_ << 0x20;
      auVar324._8_4_ = auVar206._8_4_;
      auVar324._12_4_ = auVar206._12_4_;
      auVar325._8_8_ = auVar206._8_8_;
      auVar325._0_8_ = auVar324._8_8_;
      auVar252 = minps(auVar239,auVar276);
      auVar144 = maxps(auVar206,auVar325);
      fVar379 = auVar252._0_4_ * fVar266;
      fVar394 = auVar252._4_4_ * fVar266;
      fVar463 = auVar252._8_4_ * fVar266;
      fVar413 = auVar252._12_4_ * fVar266;
      fVar316 = fVar266 * auVar144._0_4_;
      fVar390 = fVar266 * auVar144._4_4_;
      fVar399 = fVar266 * auVar144._8_4_;
      fVar266 = fVar266 * auVar144._12_4_;
      fVar375 = 1.0 / ((float)local_538._4_4_ - (float)local_538._0_4_);
      auVar175._0_8_ = CONCAT44(fVar314 - fVar305,fVar311 - fVar412);
      auVar175._8_4_ = fVar311 - fVar311;
      auVar175._12_4_ = fVar314 - fVar314;
      auVar349._8_4_ = auVar175._8_4_;
      auVar349._0_8_ = auVar175._0_8_;
      auVar349._12_4_ = auVar175._12_4_;
      auVar206 = minps(auVar349,auVar294);
      auVar144 = maxps(auVar175,auVar294);
      auVar245._8_4_ = auVar258._8_4_;
      auVar245._0_8_ = auVar258._0_8_;
      auVar245._12_4_ = auVar258._12_4_;
      auVar252 = minps(auVar245,auVar213);
      auVar206 = minps(auVar206,auVar252);
      auVar252 = maxps(auVar258,auVar213);
      auVar144 = maxps(auVar144,auVar252);
      fVar339 = auVar206._0_4_ * fVar375;
      fVar457 = auVar206._4_4_ * fVar375;
      fVar392 = fVar375 * auVar144._0_4_;
      fVar375 = fVar375 * auVar144._4_4_;
      local_518._4_4_ = local_538._0_4_;
      local_518._0_4_ = local_548.lower;
      fStack_510 = local_548.upper;
      fStack_50c = (float)local_538._4_4_;
      auVar326._4_4_ = local_538._4_4_;
      auVar326._0_4_ = local_548.upper;
      auVar326._8_4_ = fVar333;
      auVar326._12_4_ = fVar278;
      fVar302 = (local_548.lower + local_548.upper) * 0.5;
      fVar305 = ((float)local_538._0_4_ + (float)local_538._4_4_) * 0.5;
      fVar311 = (local_548.upper + fVar333) * 0.0;
      fVar314 = ((float)local_538._4_4_ + fVar278) * 0.0;
      fVar334 = (fVar462 - fVar224) * fVar302 + fVar224;
      fVar336 = (fVar464 - fVar227) * fVar302 + fVar227;
      fVar338 = (fVar318 - fVar284) * fVar302 + 0.0;
      fVar378 = (fVar319 - fVar317) * fVar302 + 0.0;
      fVar398 = (fVar355 - fVar462) * fVar302 + fVar261;
      fVar408 = (fVar377 - fVar464) * fVar302 + fVar428;
      fVar412 = (fVar261 - fVar318) * fVar302 + fVar318;
      fVar416 = (fVar428 - fVar319) * fVar302 + fVar319;
      fVar334 = (fVar398 - fVar334) * fVar302 + fVar334;
      fVar336 = (fVar408 - fVar336) * fVar302 + fVar336;
      fVar338 = (fVar412 - fVar338) * fVar302 + fVar338;
      fVar378 = (fVar416 - fVar378) * fVar302 + fVar378;
      fVar398 = ((((fVar360 - fVar355) * fVar302 + fVar355) - fVar398) * fVar302 + fVar398) -
                fVar334;
      fVar408 = ((((fVar407 - fVar377) * fVar302 + fVar377) - fVar408) * fVar302 + fVar408) -
                fVar336;
      fVar412 = ((((fVar396 - fVar261) * fVar302 + p02.field_0.v[2]) - fVar412) * fVar302 + fVar412)
                - fVar338;
      fVar416 = ((((fVar262 - fVar428) * fVar302 + p02.field_0.v[3]) - fVar416) * fVar302 + fVar416)
                - fVar378;
      fVar334 = fVar302 * fVar398 + fVar334;
      fVar336 = fVar302 * fVar408 + fVar336;
      fVar398 = fVar398 * 3.0;
      fVar408 = fVar408 * 3.0;
      fVar338 = (fVar302 * fVar412 + fVar338) - fVar334;
      fVar378 = (fVar302 * fVar416 + fVar378) - fVar336;
      fVar398 = (fVar412 * 3.0 - fVar398) * fVar305 + fVar398;
      fVar408 = (fVar416 * 3.0 - fVar408) * fVar305 + fVar408;
      auVar259._0_8_ = CONCAT44(fVar398,fVar338) ^ 0x80000000;
      auVar259._8_4_ = fVar398;
      auVar259._12_4_ = fVar398;
      fVar341 = local_548.lower - fVar302;
      fVar356 = (float)local_538._0_4_ - fVar305;
      fVar465 = local_548.upper - fVar311;
      fVar358 = (float)local_538._4_4_ - fVar314;
      fVar376 = local_548.upper - fVar302;
      fVar359 = (float)local_538._4_4_ - fVar305;
      fVar333 = fVar333 - fVar311;
      fVar278 = fVar278 - fVar314;
      fVar334 = fVar338 * fVar305 + fVar334;
      fVar336 = fVar378 * fVar305 + fVar336;
      auVar277._0_8_ = CONCAT44(fVar408,fVar378) ^ 0x8000000000000000;
      auVar277._8_4_ = -fVar408;
      auVar277._12_4_ = -fVar408;
      auVar176._0_4_ = fVar378 * fVar398 - fVar408 * fVar338;
      auVar176._4_4_ = auVar176._0_4_;
      auVar176._8_4_ = auVar176._0_4_;
      auVar176._12_4_ = auVar176._0_4_;
      auVar252 = divps(auVar277,auVar176);
      auVar144 = divps(auVar259,auVar176);
      fVar311 = auVar252._0_4_;
      fVar314 = auVar252._4_4_;
      fVar412 = auVar144._0_4_;
      fVar416 = auVar144._4_4_;
      fVar302 = fVar302 - (fVar336 * fVar412 + fVar334 * fVar311);
      fVar398 = fVar305 - (fVar336 * fVar416 + fVar334 * fVar314);
      fVar408 = fVar305 - (fVar336 * auVar144._8_4_ + fVar334 * auVar252._8_4_);
      fVar305 = fVar305 - (fVar336 * auVar144._12_4_ + fVar334 * auVar252._12_4_);
      auVar214._0_8_ = CONCAT44(fVar314 * fVar339,fVar314 * fVar379);
      auVar214._8_4_ = fVar314 * fVar394;
      auVar214._12_4_ = fVar314 * fVar457;
      auVar177._0_4_ = fVar314 * fVar316;
      auVar177._4_4_ = fVar314 * fVar392;
      auVar177._8_4_ = fVar314 * fVar390;
      auVar177._12_4_ = fVar314 * fVar375;
      auVar461._8_4_ = auVar214._8_4_;
      auVar461._0_8_ = auVar214._0_8_;
      auVar461._12_4_ = auVar214._12_4_;
      auVar239 = minps(auVar461,auVar177);
      auVar144 = maxps(auVar177,auVar214);
      auVar295._0_8_ = CONCAT44(fVar416 * fVar457,fVar416 * fVar394);
      auVar295._8_4_ = fVar416 * fVar463;
      auVar295._12_4_ = fVar416 * fVar413;
      auVar215._0_4_ = fVar416 * fVar390;
      auVar215._4_4_ = fVar416 * fVar375;
      auVar215._8_4_ = fVar416 * fVar399;
      auVar215._12_4_ = fVar416 * fVar266;
      auVar386._8_4_ = auVar295._8_4_;
      auVar386._0_8_ = auVar295._0_8_;
      auVar386._12_4_ = auVar295._12_4_;
      auVar206 = minps(auVar386,auVar215);
      auVar252 = maxps(auVar215,auVar295);
      fVar334 = 0.0 - (auVar252._0_4_ + auVar144._0_4_);
      fVar336 = 1.0 - (auVar252._4_4_ + auVar144._4_4_);
      fVar338 = 0.0 - (auVar252._8_4_ + auVar144._8_4_);
      fVar378 = 0.0 - (auVar252._12_4_ + auVar144._12_4_);
      fVar381 = 0.0 - (auVar206._0_4_ + auVar239._0_4_);
      fVar331 = 1.0 - (auVar206._4_4_ + auVar239._4_4_);
      fVar335 = 0.0 - (auVar206._8_4_ + auVar239._8_4_);
      fVar409 = 0.0 - (auVar206._12_4_ + auVar239._12_4_);
      auVar216._0_8_ = CONCAT44(fVar356 * fVar336,fVar341 * fVar334);
      auVar216._8_4_ = fVar465 * fVar338;
      auVar216._12_4_ = fVar358 * fVar378;
      auVar403._0_8_ = CONCAT44(fVar339 * fVar311,fVar379 * fVar311);
      auVar403._8_4_ = fVar394 * fVar311;
      auVar403._12_4_ = fVar457 * fVar311;
      auVar296._0_4_ = fVar311 * fVar316;
      auVar296._4_4_ = fVar311 * fVar392;
      auVar296._8_4_ = fVar311 * fVar390;
      auVar296._12_4_ = fVar311 * fVar375;
      auVar387._8_4_ = auVar403._8_4_;
      auVar387._0_8_ = auVar403._0_8_;
      auVar387._12_4_ = auVar403._12_4_;
      auVar252 = minps(auVar387,auVar296);
      auVar144 = maxps(auVar296,auVar403);
      auVar350._0_8_ = CONCAT44(fVar457 * fVar412,fVar394 * fVar412);
      auVar350._8_4_ = fVar463 * fVar412;
      auVar350._12_4_ = fVar413 * fVar412;
      auVar404._0_4_ = fVar412 * fVar390;
      auVar404._4_4_ = fVar412 * fVar375;
      auVar404._8_4_ = fVar412 * fVar399;
      auVar404._12_4_ = fVar412 * fVar266;
      auVar449._8_4_ = auVar350._8_4_;
      auVar449._0_8_ = auVar350._0_8_;
      auVar449._12_4_ = auVar350._12_4_;
      auVar239 = minps(auVar449,auVar404);
      auVar388._0_4_ = fVar341 * fVar381;
      auVar388._4_4_ = fVar356 * fVar331;
      auVar388._8_4_ = fVar465 * fVar335;
      auVar388._12_4_ = fVar358 * fVar409;
      auVar178._0_8_ = CONCAT44(fVar336 * fVar359,fVar334 * fVar376);
      auVar178._8_4_ = fVar338 * fVar333;
      auVar178._12_4_ = fVar378 * fVar278;
      auVar308._0_4_ = fVar381 * fVar376;
      auVar308._4_4_ = fVar331 * fVar359;
      auVar308._8_4_ = fVar335 * fVar333;
      auVar308._12_4_ = fVar409 * fVar278;
      auVar206 = maxps(auVar404,auVar350);
      fVar266 = 1.0 - (auVar206._0_4_ + auVar144._0_4_);
      fVar334 = 0.0 - (auVar206._4_4_ + auVar144._4_4_);
      fVar336 = 0.0 - (auVar206._8_4_ + auVar144._8_4_);
      fVar338 = 0.0 - (auVar206._12_4_ + auVar144._12_4_);
      fVar378 = 1.0 - (auVar239._0_4_ + auVar252._0_4_);
      fVar316 = 0.0 - (auVar239._4_4_ + auVar252._4_4_);
      fVar381 = 0.0 - (auVar239._8_4_ + auVar252._8_4_);
      fVar390 = 0.0 - (auVar239._12_4_ + auVar252._12_4_);
      auVar351._0_8_ = CONCAT44(fVar356 * fVar334,fVar341 * fVar266);
      auVar351._8_4_ = fVar465 * fVar336;
      auVar351._12_4_ = fVar358 * fVar338;
      auVar424._0_4_ = fVar341 * fVar378;
      auVar424._4_4_ = fVar356 * fVar316;
      auVar424._8_4_ = fVar465 * fVar381;
      auVar424._12_4_ = fVar358 * fVar390;
      auVar297._0_8_ = CONCAT44(fVar334 * fVar359,fVar266 * fVar376);
      auVar297._8_4_ = fVar336 * fVar333;
      auVar297._12_4_ = fVar338 * fVar278;
      auVar372._0_4_ = fVar378 * fVar376;
      auVar372._4_4_ = fVar316 * fVar359;
      auVar372._8_4_ = fVar381 * fVar333;
      auVar372._12_4_ = fVar390 * fVar278;
      auVar405._8_4_ = auVar351._8_4_;
      auVar405._0_8_ = auVar351._0_8_;
      auVar405._12_4_ = auVar351._12_4_;
      auVar144 = minps(auVar405,auVar424);
      auVar435._8_4_ = auVar297._8_4_;
      auVar435._0_8_ = auVar297._0_8_;
      auVar435._12_4_ = auVar297._12_4_;
      auVar252 = minps(auVar435,auVar372);
      auVar367 = minps(auVar144,auVar252);
      auVar252 = maxps(auVar424,auVar351);
      auVar144 = maxps(auVar372,auVar297);
      auVar206 = maxps(auVar144,auVar252);
      auVar352._8_4_ = auVar216._8_4_;
      auVar352._0_8_ = auVar216._0_8_;
      auVar352._12_4_ = auVar216._12_4_;
      auVar252 = minps(auVar352,auVar388);
      auVar298._8_4_ = auVar178._8_4_;
      auVar298._0_8_ = auVar178._0_8_;
      auVar298._12_4_ = auVar178._12_4_;
      auVar144 = minps(auVar298,auVar308);
      auVar252 = minps(auVar252,auVar144);
      auVar239 = maxps(auVar388,auVar216);
      auVar144 = maxps(auVar308,auVar178);
      auVar144 = maxps(auVar144,auVar239);
      auVar353._0_4_ = auVar367._4_4_ + auVar367._0_4_ + fVar302;
      auVar353._4_4_ = auVar252._4_4_ + auVar252._0_4_ + fVar398;
      auVar353._8_4_ = auVar367._8_4_ + auVar367._4_4_ + fVar408;
      auVar353._12_4_ = auVar367._12_4_ + auVar252._4_4_ + fVar305;
      fVar266 = auVar206._4_4_ + auVar206._0_4_ + fVar302;
      fVar278 = auVar144._4_4_ + auVar144._0_4_ + fVar398;
      auVar179._4_4_ = fVar278;
      auVar179._0_4_ = fVar266;
      auVar212 = maxps(_local_518,auVar353);
      auVar179._8_4_ = auVar206._8_4_ + auVar206._4_4_ + fVar408;
      auVar179._12_4_ = auVar206._12_4_ + auVar144._4_4_ + fVar305;
      auVar144 = minps(auVar179,auVar326);
      iVar124 = -(uint)(auVar144._0_4_ < auVar212._0_4_);
      iVar183 = -(uint)(auVar144._4_4_ < auVar212._4_4_);
      auVar180._4_4_ = iVar183;
      auVar180._0_4_ = iVar124;
      auVar180._8_4_ = iVar183;
      auVar180._12_4_ = iVar183;
      auVar181._8_8_ = auVar180._8_8_;
      auVar181._4_4_ = (float)iVar124;
      auVar181._0_4_ = (float)iVar124;
      iVar124 = movmskpd((uint)(fVar337 < 0.0),auVar181);
      auVar172 = _local_518;
      if (iVar124 == 0) {
        bVar109 = 0;
        if ((local_548.lower < auVar353._0_4_) && (fVar266 < local_548.upper)) {
          bVar109 = -(fVar278 < (float)local_538._4_4_) & (float)local_538._0_4_ < auVar353._4_4_;
        }
        bVar109 = bVar118 | bVar109;
        uVar111 = (ulong)CONCAT31(uVar37,bVar109);
        if (bVar109 != 1) goto LAB_00391792;
        uVar111 = 0xc9;
        do {
          uVar111 = uVar111 - 1;
          if (uVar111 == 0) goto LAB_00391e00;
          fVar278 = 1.0 - fVar302;
          fVar337 = fVar302 * fVar302 * fVar302;
          fVar336 = fVar302 * fVar302 * 3.0 * fVar278;
          fVar266 = fVar278 * fVar278 * fVar278;
          fVar338 = fVar302 * 3.0 * fVar278 * fVar278;
          fVar278 = fVar266 * fVar224 + fVar338 * fVar261 + fVar336 * fVar355 + fVar337 * fVar360;
          fVar333 = fVar266 * fVar227 + fVar338 * fVar428 + fVar336 * fVar377 + fVar337 * fVar407;
          fVar334 = fVar266 * 0.0 +
                    fVar338 * fVar318 + fVar336 * p02.field_0.v[2] + fVar337 * fVar396;
          fVar336 = fVar266 * 0.0 +
                    fVar338 * fVar319 + fVar336 * p02.field_0.v[3] + fVar337 * fVar262;
          fVar337 = (fVar334 - fVar278) * fVar398;
          fVar338 = (fVar336 - fVar333) * fVar398;
          fVar266 = (fVar334 - fVar278) * fVar398 + fVar278;
          fVar334 = (fVar336 - fVar333) * fVar398 + fVar333;
          fVar302 = fVar302 - (fVar334 * fVar412 + fVar266 * fVar311);
          fVar398 = fVar398 - (fVar334 * fVar416 + fVar266 * fVar314);
          fVar336 = ABS(fVar334);
          auVar181._0_8_ = CONCAT44(fVar334,fVar266) & 0x7fffffff7fffffff;
          auVar181._8_4_ = ABS(fVar337 + fVar278);
          auVar181._12_4_ = ABS(fVar338 + fVar333);
          auVar212._0_8_ = CONCAT44(fVar334,fVar334) & 0x7fffffff7fffffff;
          auVar212._8_4_ = (int)fVar336;
          auVar212._12_4_ = (int)fVar336;
          if (fVar336 <= ABS(fVar266)) {
            auVar212._0_4_ = ABS(fVar266);
          }
        } while (fVar249 <= auVar212._0_4_);
        if ((((0.0 <= fVar302) && (fVar302 <= 1.0)) &&
            (auVar181._4_4_ = fVar398, auVar181._0_4_ = fVar398, auVar181._8_4_ = fVar398,
            auVar181._12_4_ = fVar398, 0.0 <= fVar398)) && (fVar398 <= 1.0)) {
          fVar266 = pre->ray_space[k].vx.field_0.m128[2];
          fVar278 = pre->ray_space[k].vy.field_0.m128[2];
          fVar333 = pre->ray_space[k].vz.field_0.m128[2];
          auVar217._0_4_ = fVar406 * fVar266;
          auVar217._4_4_ = fVar389 * fVar278;
          auVar217._8_4_ = fVar410 * fVar333;
          auVar217._12_4_ = (fVar301 - 0.0) * 0.0;
          auVar218._8_8_ = auVar217._8_8_;
          auVar218._0_8_ = auVar218._8_8_;
          auVar212._4_12_ = auVar218._4_12_;
          fVar408 = 1.0 - fVar398;
          fVar378 = 1.0 - fVar302;
          fVar334 = fVar378 * fVar378 * fVar378;
          fVar336 = fVar302 * 3.0 * fVar378 * fVar378;
          fVar338 = fVar302 * fVar302 * fVar302;
          fVar337 = fVar302 * fVar302 * 3.0 * fVar378;
          auVar212._0_4_ =
               ((auVar217._8_4_ + auVar217._4_4_ + auVar217._0_4_) * fVar408 +
               (fVar283 * fVar333 + fVar426 * fVar278 + fVar228 * fVar266) * fVar398) * fVar334 +
               ((fVar411 * fVar333 + fVar373 * fVar278 + fVar425 * fVar266) * fVar408 +
               (fVar264 * fVar333 + fVar280 * fVar278 + fVar415 * fVar266) * fVar398) * fVar336 +
               ((fVar414 * fVar333 + fVar374 * fVar278 + fVar340 * fVar266) * fVar408 +
               (fVar430 * fVar333 + fVar263 * fVar278 + fVar267 * fVar266) * fVar398) * fVar337 +
               (fVar408 * (fVar456 * fVar333 + fVar397 * fVar278 + fVar357 * fVar266) +
               (fVar333 * fVar248 + fVar278 * fVar247 + fVar266 * fVar231) * fVar398) * fVar338;
          if ((fVar265 <= auVar212._0_4_) &&
             (fVar266 = *(float *)(ray + k * 4 + 0x80), auVar212._0_4_ <= fVar266)) {
            fVar416 = 1.0 - fVar398;
            fVar305 = 1.0 - fVar398;
            fVar311 = 1.0 - fVar398;
            fVar314 = 1.0 - fVar398;
            fVar278 = fVar304 * fVar416 + fVar250 * fVar398;
            fVar333 = fVar310 * fVar305 + fVar450 * fVar398;
            fVar408 = fVar313 * fVar311 + fVar454 * fVar398;
            fVar412 = fVar315 * fVar314 + fVar418 * fVar398;
            fVar316 = fVar419 * fVar416 + fVar279 * fVar398;
            fVar390 = fVar432 * fVar305 + fVar281 * fVar398;
            fVar399 = fVar436 * fVar311 + fVar188 * fVar398;
            fVar409 = fVar437 * fVar314 + fVar282 * fVar398;
            fVar381 = fVar316 - fVar278;
            fVar331 = fVar390 - fVar333;
            fVar335 = fVar399 - fVar408;
            fVar339 = fVar409 - fVar412;
            fVar278 = (((fVar278 - (fVar439 * fVar416 + fVar328 * fVar398)) * fVar378 +
                       fVar302 * fVar381) * fVar378 +
                      (fVar381 * fVar378 +
                      ((fVar416 * fVar303 + fVar190 * fVar398) - fVar316) * fVar302) * fVar302) *
                      3.0;
            fVar333 = (((fVar333 - (fVar440 * fVar305 + fVar329 * fVar398)) * fVar378 +
                       fVar302 * fVar331) * fVar378 +
                      (fVar331 * fVar378 +
                      ((fVar305 * fVar309 + fVar438 * fVar398) - fVar390) * fVar302) * fVar302) *
                      3.0;
            fVar408 = (((fVar408 - (fVar300 * fVar311 + fVar330 * fVar398)) * fVar378 +
                       fVar302 * fVar335) * fVar378 +
                      (fVar335 * fVar378 +
                      ((fVar311 * fVar312 + fVar452 * fVar398) - fVar399) * fVar302) * fVar302) *
                      3.0;
            fVar378 = (((fVar412 - (fVar301 * fVar314 + fVar332 * fVar398)) * fVar378 +
                       fVar302 * fVar339) * fVar378 +
                      (fVar339 * fVar378 +
                      ((fVar314 * fVar327 + fVar187 * fVar398) - fVar409) * fVar302) * fVar302) *
                      3.0;
            pGVar22 = (context->scene->geometries).items[uVar119].ptr;
            uVar111 = (ulong)*(uint *)(ray + k * 4 + 0x90);
            if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar412 = fVar334 * (fVar328 - fVar439) +
                        fVar336 * (fVar250 - fVar304) +
                        fVar337 * (fVar279 - fVar419) + fVar338 * (fVar190 - fVar303);
              fVar416 = fVar334 * (fVar329 - fVar440) +
                        fVar336 * (fVar450 - fVar310) +
                        fVar337 * (fVar281 - fVar432) + fVar338 * (fVar438 - fVar309);
              fVar305 = fVar334 * (fVar330 - fVar300) +
                        fVar336 * (fVar454 - fVar313) +
                        fVar337 * (fVar188 - fVar436) + fVar338 * (fVar452 - fVar312);
              fVar334 = fVar334 * (fVar332 - fVar301) +
                        fVar336 * (fVar418 - fVar315) +
                        fVar337 * (fVar282 - fVar437) + fVar338 * (fVar187 - fVar327);
              auVar299._0_4_ = fVar416 * fVar278 - fVar333 * fVar412;
              auVar299._4_4_ = fVar305 * fVar333 - fVar408 * fVar416;
              auVar299._8_4_ = fVar412 * fVar408 - fVar278 * fVar305;
              auVar299._12_4_ = fVar334 * fVar378 - fVar378 * fVar334;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = auVar212._0_4_;
                *(float *)(ray + k * 4 + 0xc0) = auVar299._4_4_;
                auVar40._4_8_ = auVar218._8_8_;
                auVar40._0_4_ = auVar299._4_4_;
                auVar219._0_8_ = auVar40._0_8_ << 0x20;
                auVar219._8_4_ = auVar299._8_4_;
                auVar219._12_4_ = auVar299._12_4_;
                auVar212._8_8_ = auVar299._8_8_;
                auVar212._0_8_ = auVar219._8_8_;
                *(float *)(ray + k * 4 + 0xd0) = auVar299._8_4_;
                *(float *)(ray + k * 4 + 0xe0) = auVar299._0_4_;
                *(float *)(ray + k * 4 + 0xf0) = fVar302;
                *(float *)(ray + k * 4 + 0x100) = fVar398;
                *(uint *)(ray + k * 4 + 0x110) = uVar120;
                *(uint *)(ray + k * 4 + 0x120) = uVar119;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar121 = context->user->instPrimID[0];
                uVar111 = (ulong)uVar121;
                *(uint *)(ray + k * 4 + 0x140) = uVar121;
              }
              else {
                local_e8 = auVar299._4_4_;
                fStack_e4 = auVar299._4_4_;
                fStack_e0 = auVar299._4_4_;
                fStack_dc = auVar299._4_4_;
                local_d8 = auVar299._8_4_;
                fStack_d4 = auVar299._8_4_;
                fStack_d0 = auVar299._8_4_;
                fStack_cc = auVar299._8_4_;
                local_c8 = auVar299._0_4_;
                fStack_c4 = auVar299._0_4_;
                fStack_c0 = auVar299._0_4_;
                fStack_bc = auVar299._0_4_;
                local_b8 = fVar302;
                fStack_b4 = fVar302;
                fStack_b0 = fVar302;
                fStack_ac = fVar302;
                local_a8 = auVar181;
                local_98 = CONCAT44(uVar120,uVar120);
                uStack_90 = CONCAT44(uVar120,uVar120);
                local_88 = CONCAT44(uVar119,uVar119);
                uStack_80 = CONCAT44(uVar119,uVar119);
                local_78 = context->user->instID[0];
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                local_68 = context->user->instPrimID[0];
                uStack_64 = local_68;
                uStack_60 = local_68;
                uStack_5c = local_68;
                *(float *)(ray + k * 4 + 0x80) = auVar212._0_4_;
                local_3b8 = *local_3a0;
                args.valid = (int *)local_3b8;
                args.geometryUserPtr = pGVar22->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&local_e8;
                args.N = 4;
                p_Var112 = pGVar22->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (p_Var112 != (RTCFilterFunctionN)0x0) {
                  p_Var112 = (RTCFilterFunctionN)(*p_Var112)(&args);
                  uVar116 = local_508;
                }
                auVar220._0_4_ = -(uint)(local_3b8._0_4_ == 0);
                auVar220._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                auVar220._8_4_ = -(uint)(local_3b8._8_4_ == 0);
                auVar220._12_4_ = -(uint)(local_3b8._12_4_ == 0);
                uVar121 = movmskps((int)p_Var112,auVar220);
                pRVar113 = (RTCRayN *)(ulong)(uVar121 ^ 0xf);
                if ((uVar121 ^ 0xf) == 0) {
                  auVar220 = auVar220 ^ _DAT_01f46b70;
                  auVar181 = local_3b8;
                }
                else {
                  p_Var112 = context->args->filter;
                  if ((p_Var112 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    p_Var112 = (RTCFilterFunctionN)(*p_Var112)(&args);
                    uVar116 = local_508;
                  }
                  auVar181._0_4_ = (float)-(uint)(local_3b8._0_4_ == 0);
                  auVar181._4_4_ = (float)-(uint)(local_3b8._4_4_ == 0);
                  auVar181._8_4_ = (float)-(uint)(local_3b8._8_4_ == 0);
                  auVar181._12_4_ = (float)-(uint)(local_3b8._12_4_ == 0);
                  auVar220 = auVar181 ^ _DAT_01f46b70;
                  uVar121 = movmskps((int)p_Var112,auVar181);
                  pRVar113 = (RTCRayN *)(ulong)(uVar121 ^ 0xf);
                  if ((uVar121 ^ 0xf) != 0) {
                    uVar121 = *(uint *)(args.hit + 4);
                    uVar122 = *(uint *)(args.hit + 8);
                    uVar73 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~(uint)auVar181._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & (uint)auVar181._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~(uint)auVar181._4_4_ & uVar121 |
                         *(uint *)(args.ray + 0xc4) & (uint)auVar181._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~(uint)auVar181._8_4_ & uVar122 |
                         *(uint *)(args.ray + 200) & (uint)auVar181._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~(uint)auVar181._12_4_ & uVar73 |
                         *(uint *)(args.ray + 0xcc) & (uint)auVar181._12_4_;
                    uVar121 = *(uint *)(args.hit + 0x14);
                    uVar122 = *(uint *)(args.hit + 0x18);
                    uVar73 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~(uint)auVar181._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & (uint)auVar181._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~(uint)auVar181._4_4_ & uVar121 |
                         *(uint *)(args.ray + 0xd4) & (uint)auVar181._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~(uint)auVar181._8_4_ & uVar122 |
                         *(uint *)(args.ray + 0xd8) & (uint)auVar181._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~(uint)auVar181._12_4_ & uVar73 |
                         *(uint *)(args.ray + 0xdc) & (uint)auVar181._12_4_;
                    uVar121 = *(uint *)(args.hit + 0x24);
                    uVar122 = *(uint *)(args.hit + 0x28);
                    uVar73 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~(uint)auVar181._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & (uint)auVar181._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~(uint)auVar181._4_4_ & uVar121 |
                         *(uint *)(args.ray + 0xe4) & (uint)auVar181._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~(uint)auVar181._8_4_ & uVar122 |
                         *(uint *)(args.ray + 0xe8) & (uint)auVar181._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~(uint)auVar181._12_4_ & uVar73 |
                         *(uint *)(args.ray + 0xec) & (uint)auVar181._12_4_;
                    uVar121 = *(uint *)(args.hit + 0x34);
                    uVar122 = *(uint *)(args.hit + 0x38);
                    uVar73 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~(uint)auVar181._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & (uint)auVar181._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~(uint)auVar181._4_4_ & uVar121 |
                         *(uint *)(args.ray + 0xf4) & (uint)auVar181._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~(uint)auVar181._8_4_ & uVar122 |
                         *(uint *)(args.ray + 0xf8) & (uint)auVar181._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~(uint)auVar181._12_4_ & uVar73 |
                         *(uint *)(args.ray + 0xfc) & (uint)auVar181._12_4_;
                    uVar121 = *(uint *)(args.hit + 0x44);
                    uVar122 = *(uint *)(args.hit + 0x48);
                    uVar73 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~(uint)auVar181._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & (uint)auVar181._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~(uint)auVar181._4_4_ & uVar121 |
                         *(uint *)(args.ray + 0x104) & (uint)auVar181._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~(uint)auVar181._8_4_ & uVar122 |
                         *(uint *)(args.ray + 0x108) & (uint)auVar181._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~(uint)auVar181._12_4_ & uVar73 |
                         *(uint *)(args.ray + 0x10c) & (uint)auVar181._12_4_;
                    uVar121 = *(uint *)(args.hit + 0x54);
                    uVar122 = *(uint *)(args.hit + 0x58);
                    uVar73 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & (uint)auVar181._0_4_ |
                         ~(uint)auVar181._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & (uint)auVar181._4_4_ |
                         ~(uint)auVar181._4_4_ & uVar121;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & (uint)auVar181._8_4_ |
                         ~(uint)auVar181._8_4_ & uVar122;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & (uint)auVar181._12_4_ |
                         ~(uint)auVar181._12_4_ & uVar73;
                    uVar121 = *(uint *)(args.hit + 100);
                    uVar122 = *(uint *)(args.hit + 0x68);
                    uVar73 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & (uint)auVar181._0_4_ |
                         ~(uint)auVar181._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & (uint)auVar181._4_4_ |
                         ~(uint)auVar181._4_4_ & uVar121;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & (uint)auVar181._8_4_ |
                         ~(uint)auVar181._8_4_ & uVar122;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & (uint)auVar181._12_4_ |
                         ~(uint)auVar181._12_4_ & uVar73;
                    uVar121 = *(uint *)(args.hit + 0x74);
                    uVar122 = *(uint *)(args.hit + 0x78);
                    uVar73 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~(uint)auVar181._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & (uint)auVar181._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~(uint)auVar181._4_4_ & uVar121 |
                         *(uint *)(args.ray + 0x134) & (uint)auVar181._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~(uint)auVar181._8_4_ & uVar122 |
                         *(uint *)(args.ray + 0x138) & (uint)auVar181._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~(uint)auVar181._12_4_ & uVar73 |
                         *(uint *)(args.ray + 0x13c) & (uint)auVar181._12_4_;
                    auVar181 = ~auVar181 & *(undefined1 (*) [16])(args.hit + 0x80) |
                               *(undefined1 (*) [16])(args.ray + 0x140) & auVar181;
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar181;
                    pRVar113 = args.ray;
                  }
                }
                auVar212._0_4_ = (float)(auVar220._0_4_ << 0x1f);
                auVar212._4_4_ = auVar220._4_4_ << 0x1f;
                auVar212._8_4_ = auVar220._8_4_ << 0x1f;
                auVar212._12_4_ = auVar220._12_4_ << 0x1f;
                uVar121 = movmskps((int)pRVar113,auVar212);
                uVar111 = (ulong)uVar121;
                if (uVar121 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar266;
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_00391e00;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }